

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RTCRayQueryFlags *pRVar1;
  float *pfVar2;
  RTCRayQueryFlags *pRVar3;
  float *pfVar4;
  RTCRayQueryFlags *pRVar5;
  float *pfVar6;
  RTCRayQueryFlags *pRVar7;
  float *pfVar8;
  RTCRayQueryFlags *pRVar9;
  float *pfVar10;
  RTCRayQueryFlags *pRVar11;
  float *pfVar12;
  RTCRayQueryFlags *pRVar13;
  float *pfVar14;
  RTCRayQueryFlags *pRVar15;
  float *pfVar16;
  undefined8 *puVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined8 uVar20;
  ushort uVar21;
  size_t sVar22;
  Scene *pSVar23;
  Geometry *pGVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  byte bVar44;
  RTCRayQueryContext *pRVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  uint uVar48;
  undefined4 uVar49;
  int iVar50;
  AABBNodeMB4D *node1;
  ulong uVar51;
  RTCRayN *pRVar52;
  uint uVar53;
  RTCIntersectArguments *pRVar54;
  long lVar55;
  ulong uVar56;
  long lVar57;
  NodeRef root;
  size_t sVar58;
  ulong uVar59;
  ulong uVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  NodeRef *pNVar65;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar66;
  bool bVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  float fVar71;
  float fVar98;
  float fVar99;
  vint4 ai;
  undefined1 auVar72 [16];
  float fVar100;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  byte bVar101;
  float fVar102;
  byte bVar121;
  byte bVar122;
  byte bVar124;
  byte bVar125;
  byte bVar126;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  byte bVar123;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar127;
  undefined1 auVar128 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar143;
  float fVar144;
  float fVar150;
  float fVar151;
  undefined1 auVar145 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar152;
  float fVar153;
  float fVar164;
  float fVar165;
  vint4 ai_1;
  undefined1 auVar168 [12];
  float fVar166;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar167;
  float fVar175;
  vint4 ai_3;
  float fVar176;
  float fVar177;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar178;
  float fVar184;
  float fVar186;
  vint4 bi_3;
  undefined1 auVar179 [16];
  float fVar189;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar185;
  float fVar187;
  float fVar188;
  float fVar190;
  float fVar191;
  undefined1 auVar183 [16];
  float fVar192;
  float fVar198;
  float fVar199;
  vint4 bi;
  float fVar200;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar201;
  float fVar206;
  float fVar207;
  vint4 bi_1;
  undefined1 auVar202 [16];
  float fVar208;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  uint uVar209;
  float fVar210;
  uint uVar214;
  uint uVar216;
  vint4 ai_2;
  uint uVar218;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar215;
  float fVar217;
  float fVar219;
  undefined1 auVar213 [16];
  float fVar220;
  uint uVar221;
  float fVar222;
  float fVar224;
  float fVar227;
  vint4 bi_2;
  uint uVar225;
  float fVar226;
  uint uVar228;
  float fVar229;
  float fVar230;
  uint uVar231;
  float fVar232;
  undefined1 auVar223 [16];
  float fVar233;
  float fVar234;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar255 [16];
  TravRayK<4,_true> *tray_00;
  UVIdentity<4> mapUV;
  undefined1 local_1c88 [8];
  float fStack_1c80;
  float fStack_1c7c;
  undefined1 local_1c68 [8];
  float fStack_1c60;
  float fStack_1c5c;
  Precalculations pre;
  undefined1 local_1c48 [8];
  float fStack_1c40;
  float fStack_1c3c;
  float old_t;
  undefined1 local_1bf8 [16];
  uint local_1be4;
  uint local_1be0;
  uint local_1bdc;
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 local_1b78;
  float fStack_1b60;
  float fStack_1b5c;
  float local_1b58 [4];
  float local_1b48;
  float fStack_1b44;
  float fStack_1b40;
  float fStack_1b3c;
  undefined1 local_1b38 [16];
  UVIdentity<4> *local_1b28;
  undefined1 local_1b18 [16];
  undefined1 local_1b08 [16];
  undefined1 local_1af8 [16];
  undefined1 local_1ae8 [8];
  float fStack_1ae0;
  float fStack_1adc;
  undefined1 local_1ad8 [16];
  undefined1 local_1ac8 [16];
  undefined1 local_1ab8 [16];
  undefined1 local_1aa8 [8];
  float fStack_1aa0;
  float fStack_1a9c;
  undefined1 local_1a98 [16];
  undefined1 local_1a88 [8];
  float fStack_1a80;
  float fStack_1a7c;
  undefined1 local_1a78 [8];
  float fStack_1a70;
  float fStack_1a6c;
  float local_1a68;
  float fStack_1a64;
  float fStack_1a60;
  float fStack_1a5c;
  undefined1 local_1a58 [8];
  float fStack_1a50;
  float fStack_1a4c;
  float local_1a48;
  float fStack_1a44;
  float fStack_1a40;
  float fStack_1a3c;
  float local_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  BVH *local_1a20;
  Intersectors *local_1a18;
  long local_1a10;
  long local_1a08;
  long local_1a00;
  ulong local_19f8;
  ulong local_19f0;
  ulong local_19e8;
  ulong local_19e0;
  float local_19d8 [4];
  undefined1 local_19c8 [16];
  undefined1 local_19b8 [16];
  undefined4 local_19a8;
  undefined4 uStack_19a4;
  undefined4 uStack_19a0;
  undefined4 uStack_199c;
  undefined4 local_1998;
  undefined4 uStack_1994;
  undefined4 uStack_1990;
  undefined4 uStack_198c;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined8 local_1978;
  undefined8 uStack_1970;
  uint local_1968;
  uint uStack_1964;
  uint uStack_1960;
  uint uStack_195c;
  uint local_1958;
  uint uStack_1954;
  uint uStack_1950;
  uint uStack_194c;
  uint local_1948;
  uint uStack_1944;
  uint uStack_1940;
  uint uStack_193c;
  uint local_1938;
  uint uStack_1934;
  uint uStack_1930;
  uint uStack_192c;
  float local_1928;
  float fStack_1924;
  float fStack_1920;
  float fStack_191c;
  float local_1918;
  float fStack_1914;
  float fStack_1910;
  float fStack_190c;
  float local_1908;
  float fStack_1904;
  float fStack_1900;
  float fStack_18fc;
  float local_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float local_18e8;
  float fStack_18e4;
  float fStack_18e0;
  float fStack_18dc;
  float local_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  vbool<4> valid0;
  TravRayK<4,_true> tray;
  float local_17a8;
  float fStack_17a4;
  float fStack_17a0;
  float local_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_1750;
  float fStack_174c;
  float fStack_1720;
  float fStack_171c;
  vint<4> itime;
  vfloat<4> ftime;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar51 = (((BVH *)This->ptr)->root).ptr;
  if (uVar51 != 8) {
    auVar195._8_4_ = 0xffffffff;
    auVar195._0_8_ = 0xffffffffffffffff;
    auVar195._12_4_ = 0xffffffff;
    auVar179 = *(undefined1 (*) [16])(ray + 0x80);
    auVar236._0_12_ = ZEXT812(0);
    auVar236._12_4_ = 0;
    auVar103._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar179._0_4_);
    auVar103._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar179._4_4_);
    auVar103._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar179._8_4_);
    auVar103._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar179._12_4_);
    uVar53 = movmskps((int)context,auVar103);
    pRVar54 = (RTCIntersectArguments *)(ulong)uVar53;
    if (uVar53 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_4_ = (undefined4)*(undefined8 *)(ray + 0x20);
      tray.org.field_0._36_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x20) >> 0x20);
      tray.org.field_0._40_4_ = (undefined4)*(undefined8 *)(ray + 0x28);
      tray.org.field_0._44_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x28) >> 0x20);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar202 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      fVar220 = (float)DAT_01f80d30;
      fVar224 = DAT_01f80d30._4_4_;
      fVar227 = DAT_01f80d30._8_4_;
      fVar230 = DAT_01f80d30._12_4_;
      auVar128._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar224);
      auVar128._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar220);
      auVar128._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar227);
      auVar128._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar230);
      auVar145 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar72._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar224);
      auVar72._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar220);
      auVar104 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)blendvps(auVar202,_DAT_01fab950,auVar128);
      auVar72._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar227);
      auVar72._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar230);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar145,_DAT_01fab950,auVar72)
      ;
      auVar145._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar224);
      auVar145._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar220);
      auVar145._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar227);
      auVar145._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar230);
      tray.rdir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)blendvps(auVar104,_DAT_01fab950,auVar145);
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar104._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar104._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar104._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar104._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeed0,_DAT_01f8c1f0,auVar104);
      auVar202._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar202._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar202._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar202._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeef0,_DAT_01faeee0,auVar202);
      auVar128 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar236);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f7a9f0,auVar128,auVar103);
      auVar179 = maxps(auVar179,auVar236);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f7aa00,auVar179,auVar103);
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar195 ^ auVar103);
      local_1a18 = This;
      local_1a20 = (BVH *)This->ptr;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar53 = 3;
      }
      else {
        pRVar54 = (RTCIntersectArguments *)
                  (CONCAT71((int7)((ulong)context->args >> 8),
                            *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01);
        uVar53 = ((char)pRVar54 == '\0') + 2;
      }
      pNVar65 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar66 = &stack_near[2].field_0;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0._8_8_ = 0x7f8000007f800000;
      stack_node[1].ptr = uVar51;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_0024517d:
      do {
        do {
          root.ptr = pNVar65[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00246f6f;
          pNVar65 = pNVar65 + -1;
          paVar66 = paVar66 + -1;
          aVar129.v = *(__m128 *)paVar66->v;
          auVar179._4_4_ = -(uint)(aVar129._4_4_ < tray.tfar.field_0.v[1]);
          auVar179._0_4_ = -(uint)(aVar129._0_4_ < tray.tfar.field_0.v[0]);
          auVar179._8_4_ = -(uint)(aVar129._8_4_ < tray.tfar.field_0.v[2]);
          auVar179._12_4_ = -(uint)(aVar129._12_4_ < tray.tfar.field_0.v[3]);
          uVar48 = movmskps((int)uVar51,auVar179);
          uVar51 = (ulong)uVar48;
        } while (uVar48 == 0);
        uVar59 = (ulong)(byte)uVar48;
        if (uVar53 < (uint)POPCOUNT(uVar48 & 0xff)) {
LAB_002451c3:
          do {
            fVar220 = aVar129.v[0];
            fVar224 = aVar129.v[1];
            fVar227 = aVar129.v[2];
            fVar230 = aVar129.v[3];
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00246f6f;
              auVar75._4_4_ = -(uint)(fVar224 < tray.tfar.field_0.v[1]);
              auVar75._0_4_ = -(uint)(fVar220 < tray.tfar.field_0.v[0]);
              auVar75._8_4_ = -(uint)(fVar227 < tray.tfar.field_0.v[2]);
              auVar75._12_4_ = -(uint)(fVar230 < tray.tfar.field_0.v[3]);
              uVar48 = movmskps((int)uVar51,auVar75);
              uVar51 = (ulong)uVar48;
              if (uVar48 != 0) {
                local_1a10 = (ulong)((uint)root.ptr & 0xf) - 8;
                if (local_1a10 == 0) {
                  lVar55 = 0;
                  aVar143 = terminated.field_0;
                }
                else {
                  uVar51 = root.ptr & 0xfffffffffffffff0;
                  local_1b78._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                  local_1b78.i[2] = terminated.field_0._8_4_ ^ 0xffffffff;
                  local_1b78.i[3] = terminated.field_0._12_4_ ^ 0xffffffff;
                  lVar55 = 0;
                  do {
                    local_1a08 = lVar55;
                    lVar55 = lVar55 * 0x90;
                    uVar59 = *(ulong *)(uVar51 + 0x20 + lVar55);
                    auVar76._8_8_ = 0;
                    auVar76._0_8_ = uVar59;
                    uVar20 = *(undefined8 *)(uVar51 + 0x24 + lVar55);
                    bVar32 = (byte)uVar59;
                    bVar101 = (byte)uVar20;
                    bVar33 = (byte)(uVar59 >> 8);
                    bVar121 = (byte)((ulong)uVar20 >> 8);
                    bVar34 = (byte)(uVar59 >> 0x10);
                    bVar122 = (byte)((ulong)uVar20 >> 0x10);
                    bVar35 = (byte)(uVar59 >> 0x18);
                    bVar123 = (byte)((ulong)uVar20 >> 0x18);
                    bVar36 = (byte)(uVar59 >> 0x20);
                    bVar124 = (byte)((ulong)uVar20 >> 0x20);
                    bVar37 = (byte)(uVar59 >> 0x28);
                    bVar125 = (byte)((ulong)uVar20 >> 0x28);
                    bVar38 = (byte)(uVar59 >> 0x30);
                    bVar126 = (byte)((ulong)uVar20 >> 0x30);
                    bVar44 = (byte)((ulong)uVar20 >> 0x38);
                    bVar39 = (byte)(uVar59 >> 0x38);
                    auVar105[0] = -((byte)((bVar32 < bVar101) * bVar32 |
                                          (bVar32 >= bVar101) * bVar101) == bVar32);
                    auVar105[1] = -((byte)((bVar33 < bVar121) * bVar33 |
                                          (bVar33 >= bVar121) * bVar121) == bVar33);
                    auVar105[2] = -((byte)((bVar34 < bVar122) * bVar34 |
                                          (bVar34 >= bVar122) * bVar122) == bVar34);
                    auVar105[3] = -((byte)((bVar35 < bVar123) * bVar35 |
                                          (bVar35 >= bVar123) * bVar123) == bVar35);
                    auVar105[4] = -((byte)((bVar36 < bVar124) * bVar36 |
                                          (bVar36 >= bVar124) * bVar124) == bVar36);
                    auVar105[5] = -((byte)((bVar37 < bVar125) * bVar37 |
                                          (bVar37 >= bVar125) * bVar125) == bVar37);
                    auVar105[6] = -((byte)((bVar38 < bVar126) * bVar38 |
                                          (bVar38 >= bVar126) * bVar126) == bVar38);
                    auVar105[7] = -((byte)((bVar39 < bVar44) * bVar39 | (bVar39 >= bVar44) * bVar44)
                                   == bVar39);
                    auVar105[8] = 0xff;
                    auVar105[9] = 0xff;
                    auVar105[10] = 0xff;
                    auVar105[0xb] = 0xff;
                    auVar105[0xc] = 0xff;
                    auVar105[0xd] = 0xff;
                    auVar105[0xe] = 0xff;
                    auVar105[0xf] = 0xff;
                    auVar130._8_4_ = 0xffffffff;
                    auVar130._0_8_ = 0xffffffffffffffff;
                    auVar130._12_4_ = 0xffffffff;
                    auVar179 = pmovzxbd(auVar76,auVar105 ^ auVar130);
                    auVar179 = auVar179 ^ auVar130;
                    auVar77._0_4_ = auVar179._0_4_ << 0x1f;
                    auVar77._4_4_ = auVar179._4_4_ << 0x1f;
                    auVar77._8_4_ = auVar179._8_4_ << 0x1f;
                    auVar77._12_4_ = auVar179._12_4_ << 0x1f;
                    uVar48 = movmskps((int)pRVar54,auVar77);
                    pRVar54 = (RTCIntersectArguments *)(ulong)uVar48;
                    if (uVar48 != 0) {
                      lVar57 = lVar55 + uVar51;
                      fVar220 = *(float *)(uVar51 + 0x80 + lVar55);
                      fVar224 = *(float *)(uVar51 + 0x84 + lVar55);
                      fVar227 = fVar224 * (*(float *)(ray + 0x70) - fVar220);
                      fVar230 = fVar224 * (*(float *)(ray + 0x74) - fVar220);
                      fVar100 = fVar224 * (*(float *)(ray + 0x78) - fVar220);
                      fVar224 = fVar224 * (*(float *)(ray + 0x7c) - fVar220);
                      uVar59 = (ulong)(byte)uVar48;
                      local_1a00 = lVar57;
                      do {
                        lVar55 = 0;
                        if (uVar59 != 0) {
                          for (; (uVar59 >> lVar55 & 1) == 0; lVar55 = lVar55 + 1) {
                          }
                        }
                        auVar78._8_8_ = 0;
                        auVar78._0_8_ = *(ulong *)(lVar57 + 0x20);
                        auVar179 = pmovzxbd(auVar78,auVar78);
                        fVar220 = *(float *)(lVar57 + 0x38);
                        fVar152 = *(float *)(lVar57 + 0x44);
                        local_1b58[0] = (float)auVar179._0_4_ * fVar152 + fVar220;
                        local_1b58[1] = (float)auVar179._4_4_ * fVar152 + fVar220;
                        local_1b58[2] = (float)auVar179._8_4_ * fVar152 + fVar220;
                        local_1b58[3] = (float)auVar179._12_4_ * fVar152 + fVar220;
                        fVar178 = local_1b58[lVar55];
                        auVar79._8_8_ = 0;
                        auVar79._0_8_ = *(ulong *)(lVar57 + 0x50);
                        auVar179 = pmovzxbd(auVar79,auVar79);
                        fVar166 = *(float *)(lVar57 + 0x68);
                        fVar184 = *(float *)(lVar57 + 0x74);
                        local_19d8[0] = (float)auVar179._0_4_ * fVar184 + fVar166;
                        local_19d8[1] = (float)auVar179._4_4_ * fVar184 + fVar166;
                        local_19d8[2] = (float)auVar179._8_4_ * fVar184 + fVar166;
                        local_19d8[3] = (float)auVar179._12_4_ * fVar184 + fVar166;
                        fVar208 = local_19d8[lVar55] - fVar178;
                        auVar169._8_8_ = 0;
                        auVar169._0_8_ = *(ulong *)(lVar57 + 0x24);
                        auVar179 = pmovzxbd(auVar169,auVar169);
                        local_1b58[0] = (float)auVar179._0_4_ * fVar152 + fVar220;
                        local_1b58[1] = (float)auVar179._4_4_ * fVar152 + fVar220;
                        local_1b58[2] = (float)auVar179._8_4_ * fVar152 + fVar220;
                        local_1b58[3] = (float)auVar179._12_4_ * fVar152 + fVar220;
                        fVar220 = local_1b58[lVar55];
                        auVar106._8_8_ = 0;
                        auVar106._0_8_ = *(ulong *)(lVar57 + 0x54);
                        auVar179 = pmovzxbd(auVar106,auVar106);
                        local_19d8[0] = (float)auVar179._0_4_ * fVar184 + fVar166;
                        local_19d8[1] = (float)auVar179._4_4_ * fVar184 + fVar166;
                        local_19d8[2] = (float)auVar179._8_4_ * fVar184 + fVar166;
                        local_19d8[3] = (float)auVar179._12_4_ * fVar184 + fVar166;
                        fVar102 = local_19d8[lVar55] - fVar220;
                        auVar131._8_8_ = 0;
                        auVar131._0_8_ = *(ulong *)(lVar57 + 0x28);
                        auVar179 = pmovzxbd(auVar131,auVar131);
                        fVar152 = *(float *)(lVar57 + 0x3c);
                        fVar166 = *(float *)(lVar57 + 0x48);
                        local_1b58[0] = (float)auVar179._0_4_ * fVar166 + fVar152;
                        local_1b58[1] = (float)auVar179._4_4_ * fVar166 + fVar152;
                        local_1b58[2] = (float)auVar179._8_4_ * fVar166 + fVar152;
                        local_1b58[3] = (float)auVar179._12_4_ * fVar166 + fVar152;
                        fVar184 = local_1b58[lVar55];
                        auVar132._8_8_ = 0;
                        auVar132._0_8_ = *(ulong *)(lVar57 + 0x58);
                        auVar179 = pmovzxbd(auVar132,auVar132);
                        fVar167 = *(float *)(lVar57 + 0x6c);
                        fVar177 = *(float *)(lVar57 + 0x78);
                        local_19d8[0] = (float)auVar179._0_4_ * fVar177 + fVar167;
                        local_19d8[1] = (float)auVar179._4_4_ * fVar177 + fVar167;
                        local_19d8[2] = (float)auVar179._8_4_ * fVar177 + fVar167;
                        local_19d8[3] = (float)auVar179._12_4_ * fVar177 + fVar167;
                        fVar127 = local_19d8[lVar55] - fVar184;
                        auVar193._8_8_ = 0;
                        auVar193._0_8_ = *(ulong *)(lVar57 + 0x2c);
                        auVar179 = pmovzxbd(auVar193,auVar193);
                        local_1b58[0] = (float)auVar179._0_4_ * fVar166 + fVar152;
                        local_1b58[1] = (float)auVar179._4_4_ * fVar166 + fVar152;
                        local_1b58[2] = (float)auVar179._8_4_ * fVar166 + fVar152;
                        local_1b58[3] = (float)auVar179._12_4_ * fVar166 + fVar152;
                        fVar152 = local_1b58[lVar55];
                        auVar147._8_8_ = 0;
                        auVar147._0_8_ = *(ulong *)(lVar57 + 0x5c);
                        auVar179 = pmovzxbd(auVar147,auVar147);
                        local_19d8[0] = (float)auVar179._0_4_ * fVar177 + fVar167;
                        local_19d8[1] = (float)auVar179._4_4_ * fVar177 + fVar167;
                        local_19d8[2] = (float)auVar179._8_4_ * fVar177 + fVar167;
                        local_19d8[3] = (float)auVar179._12_4_ * fVar177 + fVar167;
                        fVar144 = local_19d8[lVar55] - fVar152;
                        auVar154._8_8_ = 0;
                        auVar154._0_8_ = *(ulong *)(lVar57 + 0x30);
                        auVar179 = pmovzxbd(auVar154,auVar154);
                        fVar166 = *(float *)(lVar57 + 0x40);
                        fVar167 = *(float *)(lVar57 + 0x4c);
                        local_1b58[0] = (float)auVar179._0_4_ * fVar167 + fVar166;
                        local_1b58[1] = (float)auVar179._4_4_ * fVar167 + fVar166;
                        local_1b58[2] = (float)auVar179._8_4_ * fVar167 + fVar166;
                        local_1b58[3] = (float)auVar179._12_4_ * fVar167 + fVar166;
                        fVar177 = local_1b58[lVar55];
                        auVar155._8_8_ = 0;
                        auVar155._0_8_ = *(ulong *)(lVar57 + 0x60);
                        auVar179 = pmovzxbd(auVar155,auVar155);
                        fVar186 = *(float *)(lVar57 + 0x70);
                        fVar189 = *(float *)(lVar57 + 0x7c);
                        local_19d8[0] = (float)auVar179._0_4_ * fVar189 + fVar186;
                        local_19d8[1] = (float)auVar179._4_4_ * fVar189 + fVar186;
                        local_19d8[2] = (float)auVar179._8_4_ * fVar189 + fVar186;
                        local_19d8[3] = (float)auVar179._12_4_ * fVar189 + fVar186;
                        fVar153 = local_19d8[lVar55] - fVar177;
                        auVar212._8_8_ = 0;
                        auVar212._0_8_ = *(ulong *)(lVar57 + 0x34);
                        auVar179 = pmovzxbd(auVar212,auVar212);
                        local_1b58[0] = (float)auVar179._0_4_ * fVar167 + fVar166;
                        local_1b58[1] = (float)auVar179._4_4_ * fVar167 + fVar166;
                        local_1b58[2] = (float)auVar179._8_4_ * fVar167 + fVar166;
                        local_1b58[3] = (float)auVar179._12_4_ * fVar167 + fVar166;
                        fVar166 = local_1b58[lVar55];
                        auVar170._8_8_ = 0;
                        auVar170._0_8_ = *(ulong *)(lVar57 + 100);
                        auVar179 = pmovzxbd(auVar170,auVar170);
                        local_19d8[0] = (float)auVar179._0_4_ * fVar189 + fVar186;
                        local_19d8[1] = (float)auVar179._4_4_ * fVar189 + fVar186;
                        local_19d8[2] = (float)auVar179._8_4_ * fVar189 + fVar186;
                        local_19d8[3] = (float)auVar179._12_4_ * fVar189 + fVar186;
                        fVar167 = local_19d8[lVar55] - fVar166;
                        auVar80._0_8_ =
                             CONCAT44(((fVar208 * fVar230 + fVar178) - (float)tray.org.field_0._4_4_
                                      ) * tray.rdir.field_0._4_4_,
                                      ((fVar208 * fVar227 + fVar178) - (float)tray.org.field_0._0_4_
                                      ) * tray.rdir.field_0._0_4_);
                        auVar80._8_4_ =
                             ((fVar208 * fVar100 + fVar178) - (float)tray.org.field_0._8_4_) *
                             tray.rdir.field_0._8_4_;
                        auVar80._12_4_ =
                             ((fVar208 * fVar224 + fVar178) - (float)tray.org.field_0._12_4_) *
                             tray.rdir.field_0._12_4_;
                        auVar133._0_8_ =
                             CONCAT44(((fVar127 * fVar230 + fVar184) -
                                      (float)tray.org.field_0._20_4_) * tray.rdir.field_0._20_4_,
                                      ((fVar127 * fVar227 + fVar184) -
                                      (float)tray.org.field_0._16_4_) * tray.rdir.field_0._16_4_);
                        auVar133._8_4_ =
                             ((fVar127 * fVar100 + fVar184) - (float)tray.org.field_0._24_4_) *
                             tray.rdir.field_0._24_4_;
                        auVar133._12_4_ =
                             ((fVar127 * fVar224 + fVar184) - (float)tray.org.field_0._28_4_) *
                             tray.rdir.field_0._28_4_;
                        auVar156._0_8_ =
                             CONCAT44(((fVar153 * fVar230 + fVar177) -
                                      (float)tray.org.field_0._36_4_) *
                                      (float)tray.rdir.field_0._36_4_,
                                      ((fVar153 * fVar227 + fVar177) -
                                      (float)tray.org.field_0._32_4_) *
                                      (float)tray.rdir.field_0._32_4_);
                        auVar156._8_4_ =
                             ((fVar153 * fVar100 + fVar177) - (float)tray.org.field_0._40_4_) *
                             (float)tray.rdir.field_0._40_4_;
                        auVar156._12_4_ =
                             ((fVar153 * fVar224 + fVar177) - (float)tray.org.field_0._44_4_) *
                             (float)tray.rdir.field_0._44_4_;
                        auVar107._0_4_ =
                             ((fVar102 * fVar227 + fVar220) - (float)tray.org.field_0._0_4_) *
                             tray.rdir.field_0._0_4_;
                        auVar107._4_4_ =
                             ((fVar102 * fVar230 + fVar220) - (float)tray.org.field_0._4_4_) *
                             tray.rdir.field_0._4_4_;
                        auVar107._8_4_ =
                             ((fVar102 * fVar100 + fVar220) - (float)tray.org.field_0._8_4_) *
                             tray.rdir.field_0._8_4_;
                        auVar107._12_4_ =
                             ((fVar102 * fVar224 + fVar220) - (float)tray.org.field_0._12_4_) *
                             tray.rdir.field_0._12_4_;
                        auVar148._0_4_ =
                             ((fVar144 * fVar227 + fVar152) - (float)tray.org.field_0._16_4_) *
                             tray.rdir.field_0._16_4_;
                        auVar148._4_4_ =
                             ((fVar144 * fVar230 + fVar152) - (float)tray.org.field_0._20_4_) *
                             tray.rdir.field_0._20_4_;
                        auVar148._8_4_ =
                             ((fVar144 * fVar100 + fVar152) - (float)tray.org.field_0._24_4_) *
                             tray.rdir.field_0._24_4_;
                        auVar148._12_4_ =
                             ((fVar144 * fVar224 + fVar152) - (float)tray.org.field_0._28_4_) *
                             tray.rdir.field_0._28_4_;
                        auVar171._0_4_ =
                             ((fVar167 * fVar227 + fVar166) - (float)tray.org.field_0._32_4_) *
                             (float)tray.rdir.field_0._32_4_;
                        auVar171._4_4_ =
                             ((fVar167 * fVar230 + fVar166) - (float)tray.org.field_0._36_4_) *
                             (float)tray.rdir.field_0._36_4_;
                        auVar171._8_4_ =
                             ((fVar167 * fVar100 + fVar166) - (float)tray.org.field_0._40_4_) *
                             (float)tray.rdir.field_0._40_4_;
                        auVar171._12_4_ =
                             ((fVar167 * fVar224 + fVar166) - (float)tray.org.field_0._44_4_) *
                             (float)tray.rdir.field_0._44_4_;
                        auVar180._8_4_ = auVar80._8_4_;
                        auVar180._0_8_ = auVar80._0_8_;
                        auVar180._12_4_ = auVar80._12_4_;
                        auVar179 = minps(auVar180,auVar107);
                        auVar194._8_4_ = auVar133._8_4_;
                        auVar194._0_8_ = auVar133._0_8_;
                        auVar194._12_4_ = auVar133._12_4_;
                        auVar195 = minps(auVar194,auVar148);
                        auVar179 = maxps(auVar179,auVar195);
                        auVar196._8_4_ = auVar156._8_4_;
                        auVar196._0_8_ = auVar156._0_8_;
                        auVar196._12_4_ = auVar156._12_4_;
                        auVar195 = minps(auVar196,auVar171);
                        auVar179 = maxps(auVar179,auVar195);
                        auVar181._0_4_ = auVar179._0_4_ * 0.99999964;
                        auVar181._4_4_ = auVar179._4_4_ * 0.99999964;
                        auVar181._8_4_ = auVar179._8_4_ * 0.99999964;
                        auVar181._12_4_ = auVar179._12_4_ * 0.99999964;
                        auVar179 = maxps(auVar80,auVar107);
                        auVar195 = maxps(auVar133,auVar148);
                        auVar179 = minps(auVar179,auVar195);
                        auVar195 = maxps(auVar156,auVar171);
                        auVar179 = minps(auVar179,auVar195);
                        auVar81._0_4_ = auVar179._0_4_ * 1.0000004;
                        auVar81._4_4_ = auVar179._4_4_ * 1.0000004;
                        auVar81._8_4_ = auVar179._8_4_ * 1.0000004;
                        auVar81._12_4_ = auVar179._12_4_ * 1.0000004;
                        auVar195 = maxps(auVar181,(undefined1  [16])tray.tnear.field_0);
                        auVar179 = minps(auVar81,(undefined1  [16])tray.tfar.field_0);
                        uVar209 = local_1b78.i[1];
                        uVar214 = local_1b78.i[2];
                        uVar216 = local_1b78.i[3];
                        auVar182._0_4_ = -(uint)(auVar195._0_4_ <= auVar179._0_4_) & local_1b78.i[0]
                        ;
                        auVar182._4_4_ = -(uint)(auVar195._4_4_ <= auVar179._4_4_) & uVar209;
                        auVar182._8_4_ = -(uint)(auVar195._8_4_ <= auVar179._8_4_) & uVar214;
                        auVar182._12_4_ = -(uint)(auVar195._12_4_ <= auVar179._12_4_) & uVar216;
                        uVar48 = movmskps((int)pRVar54,auVar182);
                        pRVar54 = (RTCIntersectArguments *)(ulong)uVar48;
                        if (uVar48 == 0) {
                          bVar67 = false;
                        }
                        else {
                          uVar21 = *(ushort *)(lVar57 + lVar55 * 8);
                          valid_i = (vint<4> *)(ulong)uVar21;
                          uVar48 = *(uint *)(lVar57 + 0x88);
                          uVar218 = *(uint *)(lVar57 + 4 + lVar55 * 8);
                          valid0.field_0 = local_1b78;
                          uVar221 = movmskps((int)lVar55,(undefined1  [16])local_1b78);
                          uVar60 = (ulong)uVar221;
                          if (uVar221 != 0) {
                            local_19f8 = uVar59;
                            uVar56 = (ulong)(byte)uVar221;
                            local_1bdc = uVar21 & 0x7fff;
                            valid_i = (vint<4> *)(ulong)local_1bdc;
                            local_1be0 = (uint)*(ushort *)(lVar57 + 2 + lVar55 * 8);
                            local_1be4 = local_1be0 & 0x7fff;
                            local_19f0 = (ulong)(-1 < (short)uVar21);
                            local_18d8 = (float)local_1bdc;
                            fStack_18d4 = (float)(local_1bdc + 1);
                            fStack_18d0 = (float)(local_1bdc + 1);
                            fStack_18cc = (float)local_1bdc;
                            local_18e8 = (float)local_1be4;
                            fStack_18e4 = (float)local_1be4;
                            fStack_18e0 = (float)(local_1be4 + 1);
                            fStack_18dc = (float)(local_1be4 + 1);
                            local_1938 = uVar48;
                            uStack_1934 = uVar48;
                            uStack_1930 = uVar48;
                            uStack_192c = uVar48;
                            local_1948 = uVar218;
                            uStack_1944 = uVar218;
                            uStack_1940 = uVar218;
                            uStack_193c = uVar218;
                            local_19e8 = (ulong)uVar218;
                            do {
                              local_19e0 = uVar56;
                              lVar55 = 0;
                              if (uVar56 != 0) {
                                for (; (uVar56 >> lVar55 & 1) == 0; lVar55 = lVar55 + 1) {
                                }
                              }
                              pSVar23 = context->scene;
                              local_1a98._0_8_ = pSVar23;
                              pGVar24 = (pSVar23->geometries).items[uVar48].ptr;
                              lVar25 = *(long *)&pGVar24->field_0x58;
                              lVar61 = pGVar24[1].super_RefCount.refCounter.
                                       super___atomic_base<unsigned_long>._M_i * local_19e8;
                              fVar220 = pGVar24->fnumTimeSegments;
                              fVar152 = (pGVar24->time_range).lower;
                              auVar134._0_4_ = (pGVar24->time_range).upper - fVar152;
                              auVar108._4_4_ = fVar152;
                              auVar108._0_4_ = fVar152;
                              auVar108._8_4_ = fVar152;
                              auVar108._12_4_ = fVar152;
                              auVar157._0_4_ = *(float *)(ray + 0x70) - fVar152;
                              auVar157._4_4_ = *(float *)(ray + 0x74) - fVar152;
                              auVar157._8_4_ = *(float *)(ray + 0x78) - fVar152;
                              auVar157._12_4_ = *(float *)(ray + 0x7c) - fVar152;
                              auVar134._4_4_ = auVar134._0_4_;
                              auVar134._8_4_ = auVar134._0_4_;
                              auVar134._12_4_ = auVar134._0_4_;
                              auVar179 = divps(auVar157,auVar134);
                              auVar158._0_4_ = auVar179._0_4_ * fVar220;
                              auVar158._4_4_ = auVar179._4_4_ * fVar220;
                              auVar158._8_4_ = auVar179._8_4_ * fVar220;
                              auVar158._12_4_ = auVar179._12_4_ * fVar220;
                              auVar179 = roundps(auVar108,auVar158,1);
                              auVar82._0_4_ = fVar220 + -1.0;
                              auVar82._4_4_ = auVar82._0_4_;
                              auVar82._8_4_ = auVar82._0_4_;
                              auVar82._12_4_ = auVar82._0_4_;
                              auVar179 = minps(auVar179,auVar82);
                              auVar179 = maxps(auVar179,_DAT_01f7aa10);
                              ftime.field_0.v[0] = auVar158._0_4_ - auVar179._0_4_;
                              ftime.field_0.v[1] = auVar158._4_4_ - auVar179._4_4_;
                              ftime.field_0.v[2] = auVar158._8_4_ - auVar179._8_4_;
                              ftime.field_0.v[3] = auVar158._12_4_ - auVar179._12_4_;
                              itime.field_0.i[0] = (int)auVar179._0_4_;
                              itime.field_0.i[1] = (int)auVar179._4_4_;
                              itime.field_0.i[2] = (int)auVar179._8_4_;
                              itime.field_0.i[3] = (int)auVar179._12_4_;
                              uVar218 = *(uint *)(lVar25 + 4 + lVar61);
                              uVar60 = (ulong)uVar218;
                              uVar59 = (ulong)(uVar218 * local_1be4 +
                                              *(int *)(lVar25 + lVar61) + (int)valid_i);
                              lVar57 = *(long *)&pGVar24[2].numPrimitives;
                              lVar63 = (long)itime.field_0.i[lVar55] * 0x38;
                              pRVar54 = *(RTCIntersectArguments **)(lVar57 + lVar63);
                              lVar26 = *(long *)(lVar57 + 0x10 + lVar63);
                              lVar27 = *(long *)(lVar57 + 0x48 + lVar63);
                              pRVar1 = (RTCRayQueryFlags *)((long)&pRVar54->flags + lVar26 * uVar59)
                              ;
                              lVar28 = *(long *)(lVar57 + 0x38 + lVar63);
                              pfVar2 = (float *)(lVar28 + lVar27 * uVar59);
                              lVar57 = uVar59 + uVar60;
                              pRVar3 = (RTCRayQueryFlags *)
                                       ((long)&pRVar54->flags + (uVar59 + 1) * lVar26);
                              lVar64 = uVar59 + uVar60 + 1;
                              pfVar4 = (float *)(lVar28 + lVar27 * (uVar59 + 1));
                              pRVar5 = (RTCRayQueryFlags *)((long)&pRVar54->flags + lVar57 * lVar26)
                              ;
                              pfVar6 = (float *)(lVar28 + lVar27 * lVar57);
                              pRVar7 = (RTCRayQueryFlags *)((long)&pRVar54->flags + lVar64 * lVar26)
                              ;
                              lVar62 = uVar59 + local_19f0 + 1;
                              pfVar8 = (float *)(lVar28 + lVar27 * lVar64);
                              pRVar9 = (RTCRayQueryFlags *)((long)&pRVar54->flags + lVar62 * lVar26)
                              ;
                              lVar63 = lVar64 + local_19f0;
                              pfVar10 = (float *)(lVar28 + lVar27 * lVar62);
                              pRVar11 = (RTCRayQueryFlags *)
                                        ((long)&pRVar54->flags + lVar63 * lVar26);
                              pfVar12 = (float *)(lVar28 + lVar27 * lVar63);
                              uVar59 = 0;
                              if (-1 < (short)local_1be0) {
                                uVar59 = uVar60;
                              }
                              pRVar13 = (RTCRayQueryFlags *)
                                        ((long)&pRVar54->flags + (lVar57 + uVar59) * lVar26);
                              pfVar14 = (float *)(lVar28 + lVar27 * (lVar57 + uVar59));
                              pRVar15 = (RTCRayQueryFlags *)
                                        ((long)&pRVar54->flags + (lVar64 + uVar59) * lVar26);
                              fVar220 = *(float *)((long)&stack_node[-2].ptr + lVar55 * 4);
                              pfVar16 = (float *)(lVar28 + lVar27 * (lVar64 + uVar59));
                              fVar98 = (*pfVar4 - (float)*pRVar3) * fVar220 + (float)*pRVar3;
                              fVar192 = (pfVar4[1] - (float)pRVar3[1]) * fVar220 + (float)pRVar3[1];
                              fVar198 = (pfVar4[2] - (float)pRVar3[2]) * fVar220 + (float)pRVar3[2];
                              fVar242 = (*pfVar6 - (float)*pRVar5) * fVar220 + (float)*pRVar5;
                              fVar243 = (pfVar6[1] - (float)pRVar5[1]) * fVar220 + (float)pRVar5[1];
                              fVar244 = (pfVar6[2] - (float)pRVar5[2]) * fVar220 + (float)pRVar5[2];
                              fVar222 = (*pfVar8 - (float)*pRVar7) * fVar220 + (float)*pRVar7;
                              fVar226 = (pfVar8[1] - (float)pRVar7[1]) * fVar220 + (float)pRVar7[1];
                              fVar229 = (pfVar8[2] - (float)pRVar7[2]) * fVar220 + (float)pRVar7[2];
                              fVar232 = (pfVar8[3] - (float)pRVar7[3]) * fVar220 + (float)pRVar7[3];
                              fVar186 = (*pfVar10 - (float)*pRVar9) * fVar220 + (float)*pRVar9;
                              fVar208 = (pfVar10[1] - (float)pRVar9[1]) * fVar220 + (float)pRVar9[1]
                              ;
                              fVar127 = (pfVar10[2] - (float)pRVar9[2]) * fVar220 + (float)pRVar9[2]
                              ;
                              fVar233 = (*pfVar12 - (float)*pRVar11) * fVar220 + (float)*pRVar11;
                              fVar238 = (pfVar12[1] - (float)pRVar11[1]) * fVar220 +
                                        (float)pRVar11[1];
                              fVar199 = (pfVar12[2] - (float)pRVar11[2]) * fVar220 +
                                        (float)pRVar11[2];
                              fVar99 = (pfVar14[1] - (float)pRVar13[1]) * fVar220 +
                                       (float)pRVar13[1];
                              fVar165 = (pfVar14[2] - (float)pRVar13[2]) * fVar220 +
                                        (float)pRVar13[2];
                              fVar253 = (*pfVar16 - (float)*pRVar15) * fVar220 + (float)*pRVar15;
                              fVar256 = (pfVar16[1] - (float)pRVar15[1]) * fVar220 +
                                        (float)pRVar15[1];
                              fVar200 = (pfVar16[2] - (float)pRVar15[2]) * fVar220 +
                                        (float)pRVar15[2];
                              local_1b58[0] = fVar199;
                              local_1b58[1] = fVar229;
                              fVar152 = *(float *)(ray + lVar55 * 4);
                              local_1a38 = ((*pfVar2 - (float)*pRVar1) * fVar220 + (float)*pRVar1) -
                                           fVar152;
                              fStack_1a34 = fVar98 - fVar152;
                              fStack_1a30 = fVar222 - fVar152;
                              fStack_1a2c = fVar242 - fVar152;
                              fVar254 = fVar98 - fVar152;
                              fVar257 = fVar186 - fVar152;
                              fVar258 = fVar233 - fVar152;
                              fVar259 = fVar222 - fVar152;
                              fVar153 = fVar242 - fVar152;
                              fVar150 = fVar222 - fVar152;
                              fVar151 = fVar253 - fVar152;
                              fVar152 = ((*pfVar14 - (float)*pRVar13) * fVar220 + (float)*pRVar13) -
                                        fVar152;
                              fVar178 = *(float *)(ray + lVar55 * 4 + 0x10);
                              local_1a48 = ((pfVar2[1] - (float)pRVar1[1]) * fVar220 +
                                           (float)pRVar1[1]) - fVar178;
                              fStack_1a44 = fVar192 - fVar178;
                              fStack_1a40 = fVar226 - fVar178;
                              fStack_1a3c = fVar243 - fVar178;
                              fVar245 = fVar192 - fVar178;
                              fVar247 = fVar208 - fVar178;
                              fVar249 = fVar238 - fVar178;
                              fVar251 = fVar226 - fVar178;
                              fVar189 = fVar243 - fVar178;
                              fVar102 = fVar226 - fVar178;
                              fVar144 = fVar256 - fVar178;
                              fVar178 = fVar99 - fVar178;
                              local_1918 = *(float *)(ray + lVar55 * 4 + 0x20);
                              fVar201 = ((pfVar2[2] - (float)pRVar1[2]) * fVar220 + (float)pRVar1[2]
                                        ) - local_1918;
                              fVar207 = fVar198 - local_1918;
                              fVar187 = fVar229 - local_1918;
                              fVar190 = fVar244 - local_1918;
                              local_18f8 = fVar244 - local_1918;
                              fStack_18f4 = fVar229 - local_1918;
                              fStack_18f0 = fVar200 - local_1918;
                              fStack_18ec = fVar165 - local_1918;
                              local_1a58._0_4_ = fVar153 - local_1a38;
                              local_1a58._4_4_ = fVar150 - fStack_1a34;
                              fStack_1a50 = fVar151 - fStack_1a30;
                              fStack_1a4c = fVar152 - fStack_1a2c;
                              local_1a78._0_4_ = fVar189 - local_1a48;
                              local_1a78._4_4_ = fVar102 - fStack_1a44;
                              fStack_1a70 = fVar144 - fStack_1a40;
                              fStack_1a6c = fVar178 - fStack_1a3c;
                              local_1a68 = local_18f8 - fVar201;
                              fStack_1a64 = fStack_18f4 - fVar207;
                              fStack_1a60 = fStack_18f0 - fVar187;
                              fStack_1a5c = fStack_18ec - fVar190;
                              local_1c68._4_4_ = *(undefined4 *)(ray + lVar55 * 4 + 0x50);
                              local_1c48._4_4_ = *(undefined4 *)(ray + lVar55 * 4 + 0x60);
                              local_1c88._4_4_ = *(undefined4 *)(ray + lVar55 * 4 + 0x40);
                              fVar71 = ((float)local_1a78._0_4_ * (local_18f8 + fVar201) -
                                       (fVar189 + local_1a48) * local_1a68) *
                                       (float)local_1c88._4_4_ +
                                       ((fVar153 + local_1a38) * local_1a68 -
                                       (local_18f8 + fVar201) * (float)local_1a58._0_4_) *
                                       (float)local_1c68._4_4_ +
                                       ((float)local_1a58._0_4_ * (fVar189 + local_1a48) -
                                       (fVar153 + local_1a38) * (float)local_1a78._0_4_) *
                                       (float)local_1c48._4_4_;
                              fVar164 = ((float)local_1a78._4_4_ * (fStack_18f4 + fVar207) -
                                        (fVar102 + fStack_1a44) * fStack_1a64) *
                                        (float)local_1c88._4_4_ +
                                        ((fVar150 + fStack_1a34) * fStack_1a64 -
                                        (fStack_18f4 + fVar207) * (float)local_1a58._4_4_) *
                                        (float)local_1c68._4_4_ +
                                        ((float)local_1a58._4_4_ * (fVar102 + fStack_1a44) -
                                        (fVar150 + fStack_1a34) * (float)local_1a78._4_4_) *
                                        (float)local_1c48._4_4_;
                              fVar175 = (fStack_1a70 * (fStack_18f0 + fVar187) -
                                        (fVar144 + fStack_1a40) * fStack_1a60) *
                                        (float)local_1c88._4_4_ +
                                        ((fVar151 + fStack_1a30) * fStack_1a60 -
                                        (fStack_18f0 + fVar187) * fStack_1a50) *
                                        (float)local_1c68._4_4_ +
                                        (fStack_1a50 * (fVar144 + fStack_1a40) -
                                        (fVar151 + fStack_1a30) * fStack_1a70) *
                                        (float)local_1c48._4_4_;
                              fVar176 = (fStack_1a6c * (fStack_18ec + fVar190) -
                                        (fVar178 + fStack_1a3c) * fStack_1a5c) *
                                        (float)local_1c88._4_4_ +
                                        ((fVar152 + fStack_1a2c) * fStack_1a5c -
                                        (fStack_18ec + fVar190) * fStack_1a4c) *
                                        (float)local_1c68._4_4_ +
                                        (fStack_1a4c * (fVar178 + fStack_1a3c) -
                                        (fVar152 + fStack_1a2c) * fStack_1a6c) *
                                        (float)local_1c48._4_4_;
                              fStack_1914 = local_1918;
                              fStack_1910 = local_1918;
                              fStack_190c = local_1918;
                              local_1928 = fVar198 - local_1918;
                              fStack_1924 = fVar127 - local_1918;
                              fStack_1920 = fStack_1b60 - local_1918;
                              fStack_191c = fStack_1b5c - local_1918;
                              fVar234 = local_1a38 - fVar254;
                              fVar239 = fStack_1a34 - fVar257;
                              fVar240 = fStack_1a30 - fVar258;
                              fVar241 = fStack_1a2c - fVar259;
                              fVar166 = local_1a48 - fVar245;
                              fVar184 = fStack_1a44 - fVar247;
                              fVar167 = fStack_1a40 - fVar249;
                              fVar177 = fStack_1a3c - fVar251;
                              local_1a88._0_4_ = fVar201 - local_1928;
                              local_1a88._4_4_ = fVar207 - fStack_1924;
                              fStack_1a80 = fVar187 - fStack_1920;
                              fStack_1a7c = fVar190 - fStack_191c;
                              local_1aa8._0_4_ =
                                   (fVar166 * (fVar201 + local_1928) -
                                   (local_1a48 + fVar245) * (float)local_1a88._0_4_) *
                                   (float)local_1c88._4_4_ +
                                   ((local_1a38 + fVar254) * (float)local_1a88._0_4_ -
                                   (fVar201 + local_1928) * fVar234) * (float)local_1c68._4_4_ +
                                   (fVar234 * (local_1a48 + fVar245) -
                                   (local_1a38 + fVar254) * fVar166) * (float)local_1c48._4_4_;
                              local_1aa8._4_4_ =
                                   (fVar184 * (fVar207 + fStack_1924) -
                                   (fStack_1a44 + fVar247) * (float)local_1a88._4_4_) *
                                   (float)local_1c88._4_4_ +
                                   ((fStack_1a34 + fVar257) * (float)local_1a88._4_4_ -
                                   (fVar207 + fStack_1924) * fVar239) * (float)local_1c68._4_4_ +
                                   (fVar239 * (fStack_1a44 + fVar247) -
                                   (fStack_1a34 + fVar257) * fVar184) * (float)local_1c48._4_4_;
                              fStack_1aa0 = (fVar167 * (fVar187 + fStack_1920) -
                                            (fStack_1a40 + fVar249) * fStack_1a80) *
                                            (float)local_1c88._4_4_ +
                                            ((fStack_1a30 + fVar258) * fStack_1a80 -
                                            (fVar187 + fStack_1920) * fVar240) *
                                            (float)local_1c68._4_4_ +
                                            (fVar240 * (fStack_1a40 + fVar249) -
                                            (fStack_1a30 + fVar258) * fVar167) *
                                            (float)local_1c48._4_4_;
                              fStack_1a9c = (fVar177 * (fVar190 + fStack_191c) -
                                            (fStack_1a3c + fVar251) * fStack_1a7c) *
                                            (float)local_1c88._4_4_ +
                                            ((fStack_1a2c + fVar259) * fStack_1a7c -
                                            (fVar190 + fStack_191c) * fVar241) *
                                            (float)local_1c68._4_4_ +
                                            (fVar241 * (fStack_1a3c + fVar251) -
                                            (fStack_1a2c + fVar259) * fVar177) *
                                            (float)local_1c48._4_4_;
                              fVar206 = fVar254 - fVar153;
                              fVar185 = fVar257 - fVar150;
                              fVar188 = fVar258 - fVar151;
                              fVar191 = fVar259 - fVar152;
                              fVar210 = fVar245 - fVar189;
                              fVar215 = fVar247 - fVar102;
                              fVar217 = fVar249 - fVar144;
                              fVar219 = fVar251 - fVar178;
                              fVar246 = local_1928 - local_18f8;
                              fVar248 = fStack_1924 - fStack_18f4;
                              fVar250 = fStack_1920 - fStack_18f0;
                              fVar252 = fStack_191c - fStack_18ec;
                              local_1908 = local_1928 + local_18f8;
                              fStack_1904 = fStack_1924 + fStack_18f4;
                              fStack_1900 = fStack_1920 + fStack_18f0;
                              fStack_18fc = fStack_191c + fStack_18ec;
                              local_1c48._0_4_ = local_1c48._4_4_;
                              fStack_1c40 = (float)local_1c48._4_4_;
                              fStack_1c3c = (float)local_1c48._4_4_;
                              local_1c68._0_4_ = local_1c68._4_4_;
                              fStack_1c60 = (float)local_1c68._4_4_;
                              fStack_1c5c = (float)local_1c68._4_4_;
                              local_1c88._0_4_ = local_1c88._4_4_;
                              fStack_1c80 = (float)local_1c88._4_4_;
                              fStack_1c7c = (float)local_1c88._4_4_;
                              auVar135._0_4_ =
                                   (fVar210 * local_1908 - (fVar189 + fVar245) * fVar246) *
                                   (float)local_1c88._4_4_ +
                                   ((fVar153 + fVar254) * fVar246 - fVar206 * local_1908) *
                                   (float)local_1c68._4_4_ +
                                   (fVar206 * (fVar189 + fVar245) - (fVar153 + fVar254) * fVar210) *
                                   (float)local_1c48._4_4_;
                              auVar135._4_4_ =
                                   (fVar215 * fStack_1904 - (fVar102 + fVar247) * fVar248) *
                                   (float)local_1c88._4_4_ +
                                   ((fVar150 + fVar257) * fVar248 - fVar185 * fStack_1904) *
                                   (float)local_1c68._4_4_ +
                                   (fVar185 * (fVar102 + fVar247) - (fVar150 + fVar257) * fVar215) *
                                   (float)local_1c48._4_4_;
                              auVar135._8_4_ =
                                   (fVar217 * fStack_1900 - (fVar144 + fVar249) * fVar250) *
                                   (float)local_1c88._4_4_ +
                                   ((fVar151 + fVar258) * fVar250 - fVar188 * fStack_1900) *
                                   (float)local_1c68._4_4_ +
                                   (fVar188 * (fVar144 + fVar249) - (fVar151 + fVar258) * fVar217) *
                                   (float)local_1c48._4_4_;
                              auVar135._12_4_ =
                                   (fVar219 * fStack_18fc - (fVar178 + fVar251) * fVar252) *
                                   (float)local_1c88._4_4_ +
                                   ((fVar152 + fVar259) * fVar252 - fVar191 * fStack_18fc) *
                                   (float)local_1c68._4_4_ +
                                   (fVar191 * (fVar178 + fVar251) - (fVar152 + fVar259) * fVar219) *
                                   (float)local_1c48._4_4_;
                              fVar152 = fVar71 + (float)local_1aa8._0_4_ + auVar135._0_4_;
                              fVar189 = fVar164 + (float)local_1aa8._4_4_ + auVar135._4_4_;
                              fVar144 = fVar175 + fStack_1aa0 + auVar135._8_4_;
                              fVar150 = fVar176 + fStack_1a9c + auVar135._12_4_;
                              auVar83._8_4_ = fVar175;
                              auVar83._0_8_ = CONCAT44(fVar164,fVar71);
                              auVar83._12_4_ = fVar176;
                              auVar179 = minps(auVar83,_local_1aa8);
                              auVar179 = minps(auVar179,auVar135);
                              auVar203._8_4_ = fVar175;
                              auVar203._0_8_ = CONCAT44(fVar164,fVar71);
                              auVar203._12_4_ = fVar176;
                              auVar195 = maxps(auVar203,_local_1aa8);
                              auVar195 = maxps(auVar195,auVar135);
                              fVar178 = ABS(fVar152) * 1.1920929e-07;
                              fVar102 = ABS(fVar189) * 1.1920929e-07;
                              fVar153 = ABS(fVar144) * 1.1920929e-07;
                              fVar151 = ABS(fVar150) * 1.1920929e-07;
                              auVar204._4_4_ = -(uint)(auVar195._4_4_ <= fVar102);
                              auVar204._0_4_ = -(uint)(auVar195._0_4_ <= fVar178);
                              auVar204._8_4_ = -(uint)(auVar195._8_4_ <= fVar153);
                              auVar204._12_4_ = -(uint)(auVar195._12_4_ <= fVar151);
                              auVar84._4_4_ = -(uint)(-fVar102 <= auVar179._4_4_);
                              auVar84._0_4_ = -(uint)(-fVar178 <= auVar179._0_4_);
                              auVar84._8_4_ = -(uint)(-fVar153 <= auVar179._8_4_);
                              auVar84._12_4_ = -(uint)(-fVar151 <= auVar179._12_4_);
                              auVar204 = auVar204 | auVar84;
                              iVar50 = movmskps((int)lVar27,auVar204);
                              pRVar1 = (RTCRayQueryFlags *)
                                       ((long)&pRVar54->flags + lVar26 * (uVar59 + lVar63));
                              uVar20 = *(undefined8 *)pRVar1;
                              pRVar45 = *(RTCRayQueryContext **)(pRVar1 + 2);
                              puVar17 = (undefined8 *)(lVar28 + (uVar59 + lVar63) * lVar27);
                              uVar46 = *puVar17;
                              uVar47 = puVar17[1];
                              if (iVar50 == 0) {
                                auVar168._4_4_ = fVar226;
                                auVar168._0_4_ = fVar222;
                                auVar168._8_4_ = fVar229;
                                uVar218 = 0;
                                goto LAB_002465c5;
                              }
                              auVar255._0_4_ = fVar166 * fVar246 - fVar210 * (float)local_1a88._0_4_
                              ;
                              auVar255._4_4_ = fVar184 * fVar248 - fVar215 * (float)local_1a88._4_4_
                              ;
                              auVar255._8_4_ = fVar167 * fVar250 - fVar217 * fStack_1a80;
                              auVar255._12_4_ = fVar177 * fVar252 - fVar219 * fStack_1a7c;
                              auVar85._4_4_ =
                                   -(uint)(ABS(fVar184 * fStack_1a64) <
                                          ABS(fVar215 * (float)local_1a88._4_4_));
                              auVar85._0_4_ =
                                   -(uint)(ABS(fVar166 * local_1a68) <
                                          ABS(fVar210 * (float)local_1a88._0_4_));
                              auVar85._8_4_ =
                                   -(uint)(ABS(fVar167 * fStack_1a60) < ABS(fVar217 * fStack_1a80));
                              auVar85._12_4_ =
                                   -(uint)(ABS(fVar177 * fStack_1a5c) < ABS(fVar219 * fStack_1a7c));
                              auVar41._4_4_ =
                                   (float)local_1a78._4_4_ * (float)local_1a88._4_4_ -
                                   fVar184 * fStack_1a64;
                              auVar41._0_4_ =
                                   (float)local_1a78._0_4_ * (float)local_1a88._0_4_ -
                                   fVar166 * local_1a68;
                              auVar41._8_4_ = fStack_1a70 * fStack_1a80 - fVar167 * fStack_1a60;
                              auVar41._12_4_ = fStack_1a6c * fStack_1a7c - fVar177 * fStack_1a5c;
                              auVar128 = blendvps(auVar255,auVar41,auVar85);
                              auVar183._0_4_ = fVar206 * (float)local_1a88._0_4_ - fVar234 * fVar246
                              ;
                              auVar183._4_4_ = fVar185 * (float)local_1a88._4_4_ - fVar239 * fVar248
                              ;
                              auVar183._8_4_ = fVar188 * fStack_1a80 - fVar240 * fVar250;
                              auVar183._12_4_ = fVar191 * fStack_1a7c - fVar241 * fVar252;
                              auVar86._4_4_ =
                                   -(uint)(ABS((float)local_1a58._4_4_ * (float)local_1a88._4_4_) <
                                          ABS(fVar239 * fVar248));
                              auVar86._0_4_ =
                                   -(uint)(ABS((float)local_1a58._0_4_ * (float)local_1a88._0_4_) <
                                          ABS(fVar234 * fVar246));
                              auVar86._8_4_ =
                                   -(uint)(ABS(fStack_1a50 * fStack_1a80) < ABS(fVar240 * fVar250));
                              auVar86._12_4_ =
                                   -(uint)(ABS(fStack_1a4c * fStack_1a7c) < ABS(fVar241 * fVar252));
                              auVar40._4_4_ =
                                   fStack_1a64 * fVar239 -
                                   (float)local_1a58._4_4_ * (float)local_1a88._4_4_;
                              auVar40._0_4_ =
                                   local_1a68 * fVar234 -
                                   (float)local_1a58._0_4_ * (float)local_1a88._0_4_;
                              auVar40._8_4_ = fStack_1a60 * fVar240 - fStack_1a50 * fStack_1a80;
                              auVar40._12_4_ = fStack_1a5c * fVar241 - fStack_1a4c * fStack_1a7c;
                              auVar195 = blendvps(auVar183,auVar40,auVar86);
                              auVar197._0_4_ =
                                   (float)local_1a58._0_4_ * fVar166 -
                                   fVar234 * (float)local_1a78._0_4_;
                              auVar197._4_4_ =
                                   (float)local_1a58._4_4_ * fVar184 -
                                   fVar239 * (float)local_1a78._4_4_;
                              auVar197._8_4_ = fStack_1a50 * fVar167 - fVar240 * fStack_1a70;
                              auVar197._12_4_ = fStack_1a4c * fVar177 - fVar241 * fStack_1a6c;
                              auVar235._0_4_ = fVar234 * fVar210 - fVar206 * fVar166;
                              auVar235._4_4_ = fVar239 * fVar215 - fVar185 * fVar184;
                              auVar235._8_4_ = fVar240 * fVar217 - fVar188 * fVar167;
                              auVar235._12_4_ = fVar241 * fVar219 - fVar191 * fVar177;
                              auVar87._4_4_ =
                                   -(uint)(ABS(fVar239 * (float)local_1a78._4_4_) <
                                          ABS(fVar185 * fVar184));
                              auVar87._0_4_ =
                                   -(uint)(ABS(fVar234 * (float)local_1a78._0_4_) <
                                          ABS(fVar206 * fVar166));
                              auVar87._8_4_ =
                                   -(uint)(ABS(fVar240 * fStack_1a70) < ABS(fVar188 * fVar167));
                              auVar87._12_4_ =
                                   -(uint)(ABS(fVar241 * fStack_1a6c) < ABS(fVar191 * fVar177));
                              auVar236 = blendvps(auVar235,auVar197,auVar87);
                              fVar178 = (float)local_1c88._4_4_ * auVar128._0_4_ +
                                        (float)local_1c68._4_4_ * auVar195._0_4_ +
                                        (float)local_1c48._4_4_ * auVar236._0_4_;
                              fVar166 = (float)local_1c88._4_4_ * auVar128._4_4_ +
                                        (float)local_1c68._4_4_ * auVar195._4_4_ +
                                        (float)local_1c48._4_4_ * auVar236._4_4_;
                              fVar184 = (float)local_1c88._4_4_ * auVar128._8_4_ +
                                        (float)local_1c68._4_4_ * auVar195._8_4_ +
                                        (float)local_1c48._4_4_ * auVar236._8_4_;
                              fVar167 = (float)local_1c88._4_4_ * auVar128._12_4_ +
                                        (float)local_1c68._4_4_ * auVar195._12_4_ +
                                        (float)local_1c48._4_4_ * auVar236._12_4_;
                              auVar88._0_4_ = fVar178 + fVar178;
                              auVar88._4_4_ = fVar166 + fVar166;
                              auVar88._8_4_ = fVar184 + fVar184;
                              auVar88._12_4_ = fVar167 + fVar167;
                              auVar136._0_4_ =
                                   local_1a48 * auVar195._0_4_ + fVar201 * auVar236._0_4_;
                              auVar136._4_4_ =
                                   fStack_1a44 * auVar195._4_4_ + fVar207 * auVar236._4_4_;
                              auVar136._8_4_ =
                                   fStack_1a40 * auVar195._8_4_ + fVar187 * auVar236._8_4_;
                              auVar136._12_4_ =
                                   fStack_1a3c * auVar195._12_4_ + fVar190 * auVar236._12_4_;
                              fVar177 = local_1a38 * auVar128._0_4_ + auVar136._0_4_;
                              fVar102 = fStack_1a34 * auVar128._4_4_ + auVar136._4_4_;
                              fVar153 = fStack_1a30 * auVar128._8_4_ + auVar136._8_4_;
                              fVar151 = fStack_1a2c * auVar128._12_4_ + auVar136._12_4_;
                              auVar179 = rcpps(auVar136,auVar88);
                              fVar178 = auVar179._0_4_;
                              fVar166 = auVar179._4_4_;
                              fVar184 = auVar179._8_4_;
                              fVar167 = auVar179._12_4_;
                              auVar109._0_4_ =
                                   ((1.0 - auVar88._0_4_ * fVar178) * fVar178 + fVar178) *
                                   (fVar177 + fVar177);
                              auVar109._4_4_ =
                                   ((1.0 - auVar88._4_4_ * fVar166) * fVar166 + fVar166) *
                                   (fVar102 + fVar102);
                              auVar109._8_4_ =
                                   ((1.0 - auVar88._8_4_ * fVar184) * fVar184 + fVar184) *
                                   (fVar153 + fVar153);
                              auVar109._12_4_ =
                                   ((1.0 - auVar88._12_4_ * fVar167) * fVar167 + fVar167) *
                                   (fVar151 + fVar151);
                              fVar178 = *(float *)(ray + lVar55 * 4 + 0x80);
                              fVar166 = *(float *)(ray + lVar55 * 4 + 0x30);
                              iVar68 = -(uint)(fVar166 <= auVar109._4_4_);
                              iVar69 = -(uint)(fVar166 <= auVar109._8_4_);
                              iVar70 = -(uint)(fVar166 <= auVar109._12_4_);
                              auVar159._8_4_ = iVar69;
                              auVar159._4_4_ = iVar68;
                              auVar159._12_4_ = iVar70;
                              auVar137._0_4_ =
                                   -(uint)(auVar109._0_4_ <= fVar178 && fVar166 <= auVar109._0_4_) &
                                   auVar204._0_4_;
                              auVar137._4_4_ =
                                   -(uint)(auVar109._4_4_ <= fVar178 && fVar166 <= auVar109._4_4_) &
                                   auVar204._4_4_;
                              auVar137._8_4_ =
                                   -(uint)(auVar109._8_4_ <= fVar178 && fVar166 <= auVar109._8_4_) &
                                   auVar204._8_4_;
                              auVar137._12_4_ =
                                   -(uint)(auVar109._12_4_ <= fVar178 && fVar166 <= auVar109._12_4_)
                                   & auVar204._12_4_;
                              uVar218 = movmskps(iVar50,auVar137);
                              if (uVar218 == 0) {
LAB_002465c0:
                                auVar168._4_4_ = fVar226;
                                auVar168._0_4_ = fVar222;
                                auVar168._8_4_ = fVar229;
LAB_002465c5:
                                local_17a8 = (float)uVar46;
                                fStack_17a4 = (float)((ulong)uVar46 >> 0x20);
                                fStack_17a0 = (float)uVar47;
                                local_1798 = (float)uVar20;
                                fStack_1794 = (float)((ulong)uVar20 >> 0x20);
                                fStack_1790 = SUB84(pRVar45,0);
                                fVar144 = auVar168._8_4_ - fStack_190c;
                                fVar199 = fVar199 - fStack_190c;
                                fVar153 = (fVar220 * (fStack_17a0 - fStack_1790) + fStack_1790) -
                                          fStack_190c;
                                fVar200 = fVar200 - fStack_190c;
                                fVar152 = *(float *)(ray + lVar55 * 4);
                                fVar178 = *(float *)(ray + lVar55 * 4 + 0x10);
                                local_1a38 = auVar168._0_4_ - fVar152;
                                fStack_1a34 = fVar233 - fVar152;
                                fStack_1a30 = (fVar220 * (local_17a8 - local_1798) + local_1798) -
                                              fVar152;
                                fStack_1a2c = fVar253 - fVar152;
                                fVar217 = auVar168._4_4_ - fVar178;
                                fVar219 = fVar238 - fVar178;
                                fVar229 = (fVar220 * (fStack_17a4 - fStack_1794) + fStack_1794) -
                                          fVar178;
                                fVar232 = fVar256 - fVar178;
                                fVar242 = fVar242 - fVar152;
                                fVar222 = fVar222 - fVar152;
                                fVar246 = fStack_1750 - fVar152;
                                fVar247 = fStack_174c - fVar152;
                                fVar243 = fVar243 - fVar178;
                                fVar245 = fVar226 - fVar178;
                                fVar256 = fVar256 - fVar178;
                                fVar99 = fVar99 - fVar178;
                                fVar98 = fVar98 - fVar152;
                                fVar186 = fVar186 - fVar152;
                                fVar127 = fStack_1720 - fVar152;
                                fVar152 = fStack_171c - fVar152;
                                fVar192 = fVar192 - fVar178;
                                fVar208 = fVar208 - fVar178;
                                fVar238 = fVar238 - fVar178;
                                fVar226 = fVar226 - fVar178;
                                fVar167 = fVar98 - local_1a38;
                                fVar177 = fVar186 - fStack_1a34;
                                fVar189 = fVar127 - fStack_1a30;
                                fVar102 = fVar152 - fStack_1a2c;
                                fVar233 = fVar192 - fVar217;
                                fVar239 = fVar208 - fVar219;
                                fStack_1b60 = fVar238 - fVar229;
                                fStack_1b5c = fVar226 - fVar232;
                                fVar190 = local_1928 - fVar144;
                                fVar191 = fStack_1924 - fVar199;
                                fVar210 = fStack_1920 - fVar153;
                                fVar215 = fStack_191c - fVar200;
                                fVar220 = local_18f8 - local_1928;
                                fVar178 = fStack_18f4 - fStack_1924;
                                fVar166 = fStack_18f0 - fStack_1920;
                                fVar184 = fStack_18ec - fStack_191c;
                                fVar165 = local_1a38 - fVar242;
                                fVar175 = fStack_1a34 - fVar222;
                                fVar176 = fStack_1a30 - fVar246;
                                fVar198 = fStack_1a2c - fVar247;
                                fVar234 = fVar217 - fVar243;
                                fVar240 = fVar219 - fVar245;
                                fVar241 = fVar229 - fVar256;
                                fVar244 = fVar232 - fVar99;
                                fVar187 = (fVar233 * (local_1928 + fVar144) -
                                          (fVar192 + fVar217) * fVar190) * (float)local_1c88._0_4_ +
                                          ((fVar98 + local_1a38) * fVar190 -
                                          (local_1928 + fVar144) * fVar167) *
                                          (float)local_1c68._0_4_ +
                                          (fVar167 * (fVar192 + fVar217) -
                                          (fVar98 + local_1a38) * fVar233) * (float)local_1c48._0_4_
                                ;
                                fVar188 = (fVar239 * (fStack_1924 + fVar199) -
                                          (fVar208 + fVar219) * fVar191) * (float)local_1c88._4_4_ +
                                          ((fVar186 + fStack_1a34) * fVar191 -
                                          (fStack_1924 + fVar199) * fVar177) *
                                          (float)local_1c68._4_4_ +
                                          (fVar177 * (fVar208 + fVar219) -
                                          (fVar186 + fStack_1a34) * fVar239) *
                                          (float)local_1c48._4_4_;
                                local_1a88 = (undefined1  [8])CONCAT44(fVar188,fVar187);
                                fStack_1a80 = (fStack_1b60 * (fStack_1920 + fVar153) -
                                              (fVar238 + fVar229) * fVar210) * fStack_1c80 +
                                              ((fVar127 + fStack_1a30) * fVar210 -
                                              (fStack_1920 + fVar153) * fVar189) * fStack_1c60 +
                                              (fVar189 * (fVar238 + fVar229) -
                                              (fVar127 + fStack_1a30) * fStack_1b60) * fStack_1c40;
                                fStack_1a7c = (fStack_1b5c * (fStack_191c + fVar200) -
                                              (fVar226 + fVar232) * fVar215) * fStack_1c7c +
                                              ((fVar152 + fStack_1a2c) * fVar215 -
                                              (fStack_191c + fVar200) * fVar102) * fStack_1c5c +
                                              (fVar102 * (fVar226 + fVar232) -
                                              (fVar152 + fStack_1a2c) * fStack_1b5c) * fStack_1c3c;
                                local_1a48 = fVar144 - local_18f8;
                                fStack_1a44 = fVar199 - fStack_18f4;
                                fStack_1a40 = fVar153 - fStack_18f0;
                                fStack_1a3c = fVar200 - fStack_18ec;
                                local_1a98._0_4_ =
                                     (fVar234 * (local_18f8 + fVar144) -
                                     (fVar217 + fVar243) * local_1a48) * (float)local_1c88._0_4_ +
                                     ((local_1a38 + fVar242) * local_1a48 -
                                     (local_18f8 + fVar144) * fVar165) * (float)local_1c68._0_4_ +
                                     (fVar165 * (fVar217 + fVar243) -
                                     (local_1a38 + fVar242) * fVar234) * (float)local_1c48._0_4_;
                                local_1a98._4_4_ =
                                     (fVar240 * (fStack_18f4 + fVar199) -
                                     (fVar219 + fVar245) * fStack_1a44) * (float)local_1c88._4_4_ +
                                     ((fStack_1a34 + fVar222) * fStack_1a44 -
                                     (fStack_18f4 + fVar199) * fVar175) * (float)local_1c68._4_4_ +
                                     (fVar175 * (fVar219 + fVar245) -
                                     (fStack_1a34 + fVar222) * fVar240) * (float)local_1c48._4_4_;
                                local_1a98._8_4_ =
                                     (fVar241 * (fStack_18f0 + fVar153) -
                                     (fVar229 + fVar256) * fStack_1a40) * fStack_1c80 +
                                     ((fStack_1a30 + fVar246) * fStack_1a40 -
                                     (fStack_18f0 + fVar153) * fVar176) * fStack_1c60 +
                                     (fVar176 * (fVar229 + fVar256) -
                                     (fStack_1a30 + fVar246) * fVar241) * fStack_1c40;
                                local_1a98._12_4_ =
                                     (fVar244 * (fStack_18ec + fVar200) -
                                     (fVar232 + fVar99) * fStack_1a3c) * fStack_1c7c +
                                     ((fStack_1a2c + fVar247) * fStack_1a3c -
                                     (fStack_18ec + fVar200) * fVar198) * fStack_1c5c +
                                     (fVar198 * (fVar232 + fVar99) -
                                     (fStack_1a2c + fVar247) * fVar244) * fStack_1c3c;
                                fVar201 = fVar242 - fVar98;
                                fVar206 = fVar222 - fVar186;
                                fVar207 = fVar246 - fVar127;
                                fVar185 = fVar247 - fVar152;
                                uVar221 = (uint)DAT_01f7b6c0;
                                uVar225 = DAT_01f7b6c0._4_4_;
                                uVar228 = DAT_01f7b6c0._8_4_;
                                uVar231 = DAT_01f7b6c0._12_4_;
                                fVar150 = fVar243 - fVar192;
                                fVar151 = fVar245 - fVar208;
                                auVar43._4_4_ = fVar151;
                                auVar43._0_4_ = fVar150;
                                fVar71 = fVar256 - fVar238;
                                fVar164 = fVar99 - fVar226;
                                auVar91._0_4_ =
                                     (fVar150 * local_1908 - (fVar192 + fVar243) * fVar220) *
                                     (float)local_1c88._0_4_ +
                                     ((fVar98 + fVar242) * fVar220 - local_1908 * fVar201) *
                                     (float)local_1c68._0_4_ +
                                     (fVar201 * (fVar192 + fVar243) - (fVar98 + fVar242) * fVar150)
                                     * (float)local_1c48._0_4_;
                                auVar91._4_4_ =
                                     (fVar151 * fStack_1904 - (fVar208 + fVar245) * fVar178) *
                                     (float)local_1c88._4_4_ +
                                     ((fVar186 + fVar222) * fVar178 - fStack_1904 * fVar206) *
                                     (float)local_1c68._4_4_ +
                                     (fVar206 * (fVar208 + fVar245) - (fVar186 + fVar222) * fVar151)
                                     * (float)local_1c48._4_4_;
                                auVar91._8_4_ =
                                     (fVar71 * fStack_1900 - (fVar238 + fVar256) * fVar166) *
                                     fStack_1c80 +
                                     ((fVar127 + fVar246) * fVar166 - fStack_1900 * fVar207) *
                                     fStack_1c60 +
                                     (fVar207 * (fVar238 + fVar256) - (fVar127 + fVar246) * fVar71)
                                     * fStack_1c40;
                                auVar91._12_4_ =
                                     (fVar164 * fStack_18fc - (fVar226 + fVar99) * fVar184) *
                                     fStack_1c7c +
                                     ((fVar152 + fVar247) * fVar184 - fStack_18fc * fVar185) *
                                     fStack_1c5c +
                                     (fVar185 * (fVar226 + fVar99) - (fVar152 + fVar247) * fVar164)
                                     * fStack_1c3c;
                                auVar149._0_4_ = fVar187 + local_1a98._0_4_ + auVar91._0_4_;
                                auVar149._4_4_ = fVar188 + local_1a98._4_4_ + auVar91._4_4_;
                                auVar149._8_4_ = fStack_1a80 + local_1a98._8_4_ + auVar91._8_4_;
                                auVar149._12_4_ = fStack_1a7c + local_1a98._12_4_ + auVar91._12_4_;
                                auVar113._8_4_ = fStack_1a80;
                                auVar113._0_8_ = local_1a88;
                                auVar113._12_4_ = fStack_1a7c;
                                auVar179 = minps(auVar113,local_1a98);
                                auVar179 = minps(auVar179,auVar91);
                                auVar195 = maxps(_local_1a88,local_1a98);
                                auVar195 = maxps(auVar195,auVar91);
                                local_1aa8._0_4_ = (uint)auVar149._0_4_ & uVar221;
                                local_1aa8._4_4_ = (uint)auVar149._4_4_ & uVar225;
                                fStack_1aa0 = (float)((uint)auVar149._8_4_ & uVar228);
                                fStack_1a9c = (float)((uint)auVar149._12_4_ & uVar231);
                                auVar213._4_4_ =
                                     -(uint)(auVar195._4_4_ <=
                                            (float)local_1aa8._4_4_ * 1.1920929e-07);
                                auVar213._0_4_ =
                                     -(uint)(auVar195._0_4_ <=
                                            (float)local_1aa8._0_4_ * 1.1920929e-07);
                                auVar213._8_4_ =
                                     -(uint)(auVar195._8_4_ <= fStack_1aa0 * 1.1920929e-07);
                                auVar213._12_4_ =
                                     -(uint)(auVar195._12_4_ <= fStack_1a9c * 1.1920929e-07);
                                auVar114._4_4_ =
                                     -(uint)(-((float)local_1aa8._4_4_ * 1.1920929e-07) <=
                                            auVar179._4_4_);
                                auVar114._0_4_ =
                                     -(uint)(-((float)local_1aa8._0_4_ * 1.1920929e-07) <=
                                            auVar179._0_4_);
                                auVar114._8_4_ =
                                     -(uint)(-(fStack_1aa0 * 1.1920929e-07) <= auVar179._8_4_);
                                auVar114._12_4_ =
                                     -(uint)(-(fStack_1a9c * 1.1920929e-07) <= auVar179._12_4_);
                                auVar213 = auVar213 | auVar114;
                                iVar50 = movmskps(uVar218,auVar213);
                                local_1918 = fStack_190c;
                                fStack_1914 = fStack_190c;
                                fStack_1910 = fStack_190c;
                                if (iVar50 != 0) {
                                  local_1a68 = fVar217;
                                  fStack_1a64 = fVar219;
                                  fStack_1a60 = fVar229;
                                  fStack_1a5c = fVar232;
                                  auVar43._8_4_ = fVar71;
                                  auVar43._12_4_ = fVar164;
                                  _local_1a78 = auVar43;
                                  _local_1a58 = auVar149;
                                  auVar160._0_4_ = fVar233 * local_1a48 - fVar234 * fVar190;
                                  auVar160._4_4_ = fVar239 * fStack_1a44 - fVar240 * fVar191;
                                  auVar160._8_4_ = fStack_1b60 * fStack_1a40 - fVar241 * fVar210;
                                  auVar160._12_4_ = fStack_1b5c * fStack_1a3c - fVar244 * fVar215;
                                  auVar223._0_4_ = fVar234 * fVar220 - fVar150 * local_1a48;
                                  auVar223._4_4_ = fVar240 * fVar178 - fVar151 * fStack_1a44;
                                  auVar223._8_4_ = fVar241 * fVar166 - fVar71 * fStack_1a40;
                                  auVar223._12_4_ = fVar244 * fVar184 - fVar164 * fStack_1a3c;
                                  auVar92._4_4_ =
                                       -(uint)(ABS(fVar240 * fVar191) < ABS(fVar151 * fStack_1a44));
                                  auVar92._0_4_ =
                                       -(uint)(ABS(fVar234 * fVar190) < ABS(fVar150 * local_1a48));
                                  auVar92._8_4_ =
                                       -(uint)(ABS(fVar241 * fVar210) < ABS(fVar71 * fStack_1a40));
                                  auVar92._12_4_ =
                                       -(uint)(ABS(fVar244 * fVar215) < ABS(fVar164 * fStack_1a3c));
                                  auVar236 = blendvps(auVar223,auVar160,auVar92);
                                  auVar173._0_4_ = fVar190 * fVar165 - fVar167 * local_1a48;
                                  auVar173._4_4_ = fVar191 * fVar175 - fVar177 * fStack_1a44;
                                  auVar173._8_4_ = fVar210 * fVar176 - fVar189 * fStack_1a40;
                                  auVar173._12_4_ = fVar215 * fVar198 - fVar102 * fStack_1a3c;
                                  auVar205._0_4_ = fVar201 * local_1a48 - fVar165 * fVar220;
                                  auVar205._4_4_ = fVar206 * fStack_1a44 - fVar175 * fVar178;
                                  auVar205._8_4_ = fVar207 * fStack_1a40 - fVar176 * fVar166;
                                  auVar205._12_4_ = fVar185 * fStack_1a3c - fVar198 * fVar184;
                                  auVar93._4_4_ =
                                       -(uint)((float)((uint)(fVar177 * fStack_1a44) & uVar225) <
                                              (float)((uint)(fVar175 * fVar178) & uVar225));
                                  auVar93._0_4_ =
                                       -(uint)((float)((uint)(fVar167 * local_1a48) & uVar221) <
                                              (float)((uint)(fVar165 * fVar220) & uVar221));
                                  auVar93._8_4_ =
                                       -(uint)((float)((uint)(fVar189 * fStack_1a40) & uVar228) <
                                              (float)((uint)(fVar176 * fVar166) & uVar228));
                                  auVar93._12_4_ =
                                       -(uint)((float)((uint)(fVar102 * fStack_1a3c) & uVar231) <
                                              (float)((uint)(fVar198 * fVar184) & uVar231));
                                  auVar195 = blendvps(auVar205,auVar173,auVar93);
                                  auVar237._0_4_ = fVar165 * fVar150 - fVar201 * fVar234;
                                  auVar237._4_4_ = fVar175 * fVar151 - fVar206 * fVar240;
                                  auVar237._8_4_ = fVar176 * fVar71 - fVar207 * fVar241;
                                  auVar237._12_4_ = fVar198 * fVar164 - fVar185 * fVar244;
                                  auVar94._4_4_ =
                                       -(uint)((float)((uint)(fVar175 * fVar239) & uVar225) <
                                              (float)((uint)(fVar206 * fVar240) & uVar225));
                                  auVar94._0_4_ =
                                       -(uint)((float)((uint)(fVar165 * fVar233) & uVar221) <
                                              (float)((uint)(fVar201 * fVar234) & uVar221));
                                  auVar94._8_4_ =
                                       -(uint)((float)((uint)(fVar176 * fStack_1b60) & uVar228) <
                                              (float)((uint)(fVar207 * fVar241) & uVar228));
                                  auVar94._12_4_ =
                                       -(uint)((float)((uint)(fVar198 * fStack_1b5c) & uVar231) <
                                              (float)((uint)(fVar185 * fVar244) & uVar231));
                                  auVar42._4_4_ = fVar177 * fVar240 - fVar175 * fVar239;
                                  auVar42._0_4_ = fVar167 * fVar234 - fVar165 * fVar233;
                                  auVar42._8_4_ = fVar189 * fVar241 - fVar176 * fStack_1b60;
                                  auVar42._12_4_ = fVar102 * fVar244 - fVar198 * fStack_1b5c;
                                  auVar128 = blendvps(auVar237,auVar42,auVar94);
                                  fVar220 = (float)local_1c88._0_4_ * auVar236._0_4_ +
                                            (float)local_1c68._0_4_ * auVar195._0_4_ +
                                            (float)local_1c48._0_4_ * auVar128._0_4_;
                                  fVar152 = (float)local_1c88._4_4_ * auVar236._4_4_ +
                                            (float)local_1c68._4_4_ * auVar195._4_4_ +
                                            (float)local_1c48._4_4_ * auVar128._4_4_;
                                  fVar178 = fStack_1c80 * auVar236._8_4_ +
                                            fStack_1c60 * auVar195._8_4_ +
                                            fStack_1c40 * auVar128._8_4_;
                                  fVar166 = fStack_1c7c * auVar236._12_4_ +
                                            fStack_1c5c * auVar195._12_4_ +
                                            fStack_1c3c * auVar128._12_4_;
                                  auVar161._0_4_ = fVar220 + fVar220;
                                  auVar161._4_4_ = fVar152 + fVar152;
                                  auVar161._8_4_ = fVar178 + fVar178;
                                  auVar161._12_4_ = fVar166 + fVar166;
                                  auVar115._0_4_ = fVar144 * auVar128._0_4_;
                                  auVar115._4_4_ = fVar199 * auVar128._4_4_;
                                  auVar115._8_4_ = fVar153 * auVar128._8_4_;
                                  auVar115._12_4_ = fVar200 * auVar128._12_4_;
                                  fVar178 = local_1a38 * auVar236._0_4_ +
                                            fVar217 * auVar195._0_4_ + auVar115._0_4_;
                                  fVar166 = fStack_1a34 * auVar236._4_4_ +
                                            fVar219 * auVar195._4_4_ + auVar115._4_4_;
                                  fVar177 = fStack_1a30 * auVar236._8_4_ +
                                            fVar229 * auVar195._8_4_ + auVar115._8_4_;
                                  fVar186 = fStack_1a2c * auVar236._12_4_ +
                                            fVar232 * auVar195._12_4_ + auVar115._12_4_;
                                  auVar179 = rcpps(auVar115,auVar161);
                                  fVar220 = auVar179._0_4_;
                                  fVar152 = auVar179._4_4_;
                                  fVar184 = auVar179._8_4_;
                                  fVar167 = auVar179._12_4_;
                                  fVar178 = ((1.0 - auVar161._0_4_ * fVar220) * fVar220 + fVar220) *
                                            (fVar178 + fVar178);
                                  fVar166 = ((1.0 - auVar161._4_4_ * fVar152) * fVar152 + fVar152) *
                                            (fVar166 + fVar166);
                                  fVar184 = ((1.0 - auVar161._8_4_ * fVar184) * fVar184 + fVar184) *
                                            (fVar177 + fVar177);
                                  fVar167 = ((1.0 - auVar161._12_4_ * fVar167) * fVar167 + fVar167)
                                            * (fVar186 + fVar186);
                                  fVar220 = *(float *)(ray + lVar55 * 4 + 0x80);
                                  fVar152 = *(float *)(ray + lVar55 * 4 + 0x30);
                                  auVar116._0_4_ =
                                       -(uint)(fVar178 <= fVar220 && fVar152 <= fVar178) &
                                       auVar213._0_4_;
                                  auVar116._4_4_ =
                                       -(uint)(fVar166 <= fVar220 && fVar152 <= fVar166) &
                                       auVar213._4_4_;
                                  auVar116._8_4_ =
                                       -(uint)(fVar184 <= fVar220 && fVar152 <= fVar184) &
                                       auVar213._8_4_;
                                  auVar116._12_4_ =
                                       -(uint)(fVar167 <= fVar220 && fVar152 <= fVar167) &
                                       auVar213._12_4_;
                                  iVar50 = movmskps(iVar50,auVar116);
                                  if (iVar50 != 0) {
                                    auVar117._0_4_ = auVar116._0_4_ & -(uint)(auVar161._0_4_ != 0.0)
                                    ;
                                    auVar117._4_4_ = auVar116._4_4_ & -(uint)(auVar161._4_4_ != 0.0)
                                    ;
                                    auVar117._8_4_ = auVar116._8_4_ & -(uint)(auVar161._8_4_ != 0.0)
                                    ;
                                    auVar117._12_4_ =
                                         auVar116._12_4_ & -(uint)(auVar161._12_4_ != 0.0);
                                    uVar218 = movmskps(iVar50,auVar117);
                                    if (uVar218 != 0) {
                                      local_1b38 = auVar149;
                                      local_1b28 = &mapUV;
                                      local_1b18 = auVar117;
                                      local_1ae8._4_4_ = fVar166;
                                      local_1ae8._0_4_ = fVar178;
                                      fStack_1ae0 = fVar184;
                                      fStack_1adc = fVar167;
                                      local_1ad8 = auVar236;
                                      local_1ac8 = auVar195;
                                      local_1ab8 = auVar128;
                                      auVar118._4_12_ = auVar117._4_12_;
                                      auVar118._0_4_ =
                                           (float)(int)(*(ushort *)(lVar25 + 8 + lVar61) - 1);
                                      auVar142._0_4_ = auVar149._0_4_ - local_1a98._0_4_;
                                      auVar142._4_4_ = auVar149._4_4_ - local_1a98._4_4_;
                                      auVar142._8_4_ = auVar149._8_4_ - local_1a98._8_4_;
                                      auVar142._12_4_ = auVar149._12_4_ - local_1a98._12_4_;
                                      auVar162._4_4_ = auVar117._4_4_;
                                      auVar162._0_4_ = auVar118._0_4_;
                                      auVar162._8_4_ = auVar117._8_4_;
                                      auVar162._12_4_ = auVar117._12_4_;
                                      auVar179 = rcpss(auVar162,auVar118);
                                      local_1b58[3] =
                                           (2.0 - auVar118._0_4_ * auVar179._0_4_) * auVar179._0_4_;
                                      auVar163._4_12_ = auVar179._4_12_;
                                      auVar163._0_4_ =
                                           (float)(int)(*(ushort *)(lVar25 + 10 + lVar61) - 1);
                                      auVar174._4_4_ = auVar179._4_4_;
                                      auVar174._0_4_ = auVar163._0_4_;
                                      auVar174._8_4_ = auVar179._8_4_;
                                      auVar174._12_4_ = auVar179._12_4_;
                                      auVar179 = rcpss(auVar174,auVar163);
                                      fStack_1b3c = (2.0 - auVar163._0_4_ * auVar179._0_4_) *
                                                    auVar179._0_4_;
                                      local_1b58[0] =
                                           local_1b58[3] *
                                           (auVar149._0_4_ * local_18d8 + (auVar149._0_4_ - fVar187)
                                           );
                                      local_1b58[1] =
                                           local_1b58[3] *
                                           (auVar149._4_4_ * fStack_18d4 +
                                           (auVar149._4_4_ - fVar188));
                                      local_1b58[2] =
                                           local_1b58[3] *
                                           (auVar149._8_4_ * fStack_18d0 +
                                           (auVar149._8_4_ - fStack_1a80));
                                      local_1b58[3] =
                                           local_1b58[3] *
                                           (auVar149._12_4_ * fStack_18cc +
                                           (auVar149._12_4_ - fStack_1a7c));
                                      local_1b48 = fStack_1b3c *
                                                   (auVar149._0_4_ * local_18e8 + auVar142._0_4_);
                                      fStack_1b44 = fStack_1b3c *
                                                    (auVar149._4_4_ * fStack_18e4 + auVar142._4_4_);
                                      fStack_1b40 = fStack_1b3c *
                                                    (auVar149._8_4_ * fStack_18e0 + auVar142._8_4_);
                                      fStack_1b3c = fStack_1b3c *
                                                    (auVar149._12_4_ * fStack_18dc + auVar142._12_4_
                                                    );
                                      pGVar24 = (context->scene->geometries).items[uVar48].ptr;
                                      pRVar54 = (RTCIntersectArguments *)
                                                (ulong)*(uint *)(ray + lVar55 * 4 + 0x90);
                                      if ((pGVar24->mask & *(uint *)(ray + lVar55 * 4 + 0x90)) != 0)
                                      {
                                        pRVar54 = context->args;
                                        if ((pRVar54->filter == (RTCFilterFunctionN)0x0) &&
                                           (pGVar24->occlusionFilterN == (RTCFilterFunctionN)0x0))
                                        goto LAB_00246b40;
                                        auVar179 = rcpps(auVar142,auVar149);
                                        fVar152 = auVar179._0_4_;
                                        fVar178 = auVar179._4_4_;
                                        fVar166 = auVar179._8_4_;
                                        fVar184 = auVar179._12_4_;
                                        fVar152 = (float)(-(uint)(1e-18 <= (float)local_1aa8._0_4_)
                                                         & (uint)(((float)DAT_01f7ba10 -
                                                                  auVar149._0_4_ * fVar152) *
                                                                  fVar152 + fVar152));
                                        fVar178 = (float)(-(uint)(1e-18 <= (float)local_1aa8._4_4_)
                                                         & (uint)((DAT_01f7ba10._4_4_ -
                                                                  auVar149._4_4_ * fVar178) *
                                                                  fVar178 + fVar178));
                                        fVar166 = (float)(-(uint)(1e-18 <= fStack_1aa0) &
                                                         (uint)((DAT_01f7ba10._8_4_ -
                                                                auVar149._8_4_ * fVar166) * fVar166
                                                               + fVar166));
                                        fVar184 = (float)(-(uint)(1e-18 <= fStack_1a9c) &
                                                         (uint)((DAT_01f7ba10._12_4_ -
                                                                auVar149._12_4_ * fVar184) * fVar184
                                                               + fVar184));
                                        auVar95._0_4_ = local_1b58[0] * fVar152;
                                        auVar95._4_4_ = local_1b58[1] * fVar178;
                                        auVar95._8_4_ = local_1b58[2] * fVar166;
                                        auVar95._12_4_ = local_1b58[3] * fVar184;
                                        local_1b08 = minps(auVar95,_DAT_01f7ba10);
                                        auVar119._0_4_ = local_1b48 * fVar152;
                                        auVar119._4_4_ = fStack_1b44 * fVar178;
                                        auVar119._8_4_ = fStack_1b40 * fVar166;
                                        auVar119._12_4_ = fStack_1b3c * fVar184;
                                        local_1af8 = minps(auVar119,_DAT_01f7ba10);
                                        uVar60 = (ulong)(uVar218 & 0xff);
                                        uVar59 = 0;
                                        if (uVar60 != 0) {
                                          for (; ((uVar218 & 0xff) >> uVar59 & 1) == 0;
                                              uVar59 = uVar59 + 1) {
                                          }
                                        }
                                        auVar179 = *(undefined1 (*) [16])
                                                    (mm_lookupmask_ps +
                                                    (long)(1 << ((byte)lVar55 & 0x1f)) * 0x10);
                                        do {
                                          local_19a8 = *(undefined4 *)(local_1b08 + uVar59 * 4);
                                          local_1998 = *(undefined4 *)(local_1af8 + uVar59 * 4);
                                          *(undefined4 *)(ray + lVar55 * 4 + 0x80) =
                                               *(undefined4 *)(local_1ae8 + uVar59 * 4);
                                          args.context = context->user;
                                          local_19d8[0] = *(float *)(local_1ad8 + uVar59 * 4);
                                          uVar49 = *(undefined4 *)(local_1ac8 + uVar59 * 4);
                                          uVar18 = *(undefined4 *)(local_1ab8 + uVar59 * 4);
                                          local_19c8._4_4_ = uVar49;
                                          local_19c8._0_4_ = uVar49;
                                          local_19c8._8_4_ = uVar49;
                                          local_19c8._12_4_ = uVar49;
                                          local_19b8._4_4_ = uVar18;
                                          local_19b8._0_4_ = uVar18;
                                          local_19b8._8_4_ = uVar18;
                                          local_19b8._12_4_ = uVar18;
                                          local_19d8[1] = local_19d8[0];
                                          local_19d8[2] = local_19d8[0];
                                          local_19d8[3] = local_19d8[0];
                                          uStack_19a4 = local_19a8;
                                          uStack_19a0 = local_19a8;
                                          uStack_199c = local_19a8;
                                          uStack_1994 = local_1998;
                                          uStack_1990 = local_1998;
                                          uStack_198c = local_1998;
                                          local_1988 = CONCAT44(uStack_1944,local_1948);
                                          uStack_1980 = CONCAT44(uStack_193c,uStack_1940);
                                          local_1978 = CONCAT44(uStack_1934,local_1938);
                                          uStack_1970 = CONCAT44(uStack_192c,uStack_1930);
                                          local_1968 = (args.context)->instID[0];
                                          uStack_1964 = local_1968;
                                          uStack_1960 = local_1968;
                                          uStack_195c = local_1968;
                                          local_1958 = (args.context)->instPrimID[0];
                                          uStack_1954 = local_1958;
                                          uStack_1950 = local_1958;
                                          uStack_194c = local_1958;
                                          args.valid = (int *)local_1bf8;
                                          pRVar54 = (RTCIntersectArguments *)pGVar24->userPtr;
                                          args.hit = (RTCHitN *)local_19d8;
                                          args.N = 4;
                                          local_1bf8 = auVar179;
                                          args.geometryUserPtr = pRVar54;
                                          args.ray = (RTCRayN *)ray;
                                          if (pGVar24->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                          {
                                            (*pGVar24->occlusionFilterN)(&args);
                                          }
                                          if (local_1bf8 == (undefined1  [16])0x0) {
                                            auVar120._8_4_ = 0xffffffff;
                                            auVar120._0_8_ = 0xffffffffffffffff;
                                            auVar120._12_4_ = 0xffffffff;
                                            auVar120 = auVar120 ^ _DAT_01f7ae20;
                                          }
                                          else {
                                            pRVar54 = context->args;
                                            if ((pRVar54->filter != (RTCFilterFunctionN)0x0) &&
                                               (((pRVar54->flags &
                                                 RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                 RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                                              (*pRVar54->filter)(&args);
                                            }
                                            auVar96._0_4_ = -(uint)(local_1bf8._0_4_ == 0);
                                            auVar96._4_4_ = -(uint)(local_1bf8._4_4_ == 0);
                                            auVar96._8_4_ = -(uint)(local_1bf8._8_4_ == 0);
                                            auVar96._12_4_ = -(uint)(local_1bf8._12_4_ == 0);
                                            auVar120 = auVar96 ^ _DAT_01f7ae20;
                                            auVar195 = blendvps(_DAT_01f7aa00,
                                                                *(undefined1 (*) [16])
                                                                 (args.ray + 0x80),auVar96);
                                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar195;
                                          }
                                          if ((_DAT_01f7bb20 & auVar120) != (undefined1  [16])0x0)
                                          goto LAB_00246b40;
                                          *(float *)(ray + lVar55 * 4 + 0x80) = fVar220;
                                          uVar60 = uVar60 ^ 1L << (uVar59 & 0x3f);
                                          uVar59 = 0;
                                          if (uVar60 != 0) {
                                            for (; (uVar60 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1)
                                            {
                                            }
                                          }
                                        } while (uVar60 != 0);
                                      }
                                    }
                                  }
                                }
                              }
                              else {
                                auVar138._0_4_ = auVar137._0_4_ & -(uint)(auVar88._0_4_ != 0.0);
                                auVar138._4_4_ = auVar137._4_4_ & -(uint)(auVar88._4_4_ != 0.0);
                                auVar138._8_4_ = auVar137._8_4_ & -(uint)(auVar88._8_4_ != 0.0);
                                auVar138._12_4_ = auVar137._12_4_ & -(uint)(auVar88._12_4_ != 0.0);
                                uVar221 = movmskps((int)pRVar54,auVar138);
                                pRVar54 = (RTCIntersectArguments *)(ulong)uVar221;
                                if (uVar221 == 0) goto LAB_002465c0;
                                local_1b38._4_4_ = fVar189;
                                local_1b38._0_4_ = fVar152;
                                local_1b38._8_4_ = fVar144;
                                local_1b38._12_4_ = fVar150;
                                local_1b28 = &mapUV;
                                local_1b18 = auVar138;
                                _local_1ae8 = auVar109;
                                local_1ad8 = auVar128;
                                local_1ac8 = auVar195;
                                local_1ab8 = auVar236;
                                auVar110._4_12_ = auVar109._4_12_;
                                auVar110._0_4_ = (float)(int)(*(ushort *)(lVar25 + 8 + lVar61) - 1);
                                auVar139._4_4_ = auVar109._4_4_;
                                auVar139._0_4_ = auVar110._0_4_;
                                auVar139._8_4_ = auVar109._8_4_;
                                auVar139._12_4_ = auVar109._12_4_;
                                auVar179 = rcpss(auVar139,auVar110);
                                auVar159._0_4_ = (float)(int)(*(ushort *)(lVar25 + 10 + lVar61) - 1)
                                ;
                                local_1b58[3] =
                                     (2.0 - auVar110._0_4_ * auVar179._0_4_) * auVar179._0_4_;
                                auVar140._4_4_ = iVar68;
                                auVar140._0_4_ = auVar159._0_4_;
                                auVar140._8_4_ = iVar69;
                                auVar140._12_4_ = iVar70;
                                auVar179 = rcpss(auVar140,auVar159);
                                fVar166 = (2.0 - auVar159._0_4_ * auVar179._0_4_) * auVar179._0_4_;
                                local_1b58[0] = local_1b58[3] * (fVar71 + fVar152 * local_18d8);
                                local_1b58[1] = local_1b58[3] * (fVar164 + fVar189 * fStack_18d4);
                                local_1b58[2] = local_1b58[3] * (fVar175 + fVar144 * fStack_18d0);
                                local_1b58[3] = local_1b58[3] * (fVar176 + fVar150 * fStack_18cc);
                                auVar141._0_4_ = fVar152 * local_18e8 + (float)local_1aa8._0_4_;
                                auVar141._4_4_ = fVar189 * fStack_18e4 + (float)local_1aa8._4_4_;
                                auVar141._8_4_ = fVar144 * fStack_18e0 + fStack_1aa0;
                                auVar141._12_4_ = fVar150 * fStack_18dc + fStack_1a9c;
                                local_1b48 = fVar166 * auVar141._0_4_;
                                fStack_1b44 = fVar166 * auVar141._4_4_;
                                fStack_1b40 = fVar166 * auVar141._8_4_;
                                fStack_1b3c = fVar166 * auVar141._12_4_;
                                pGVar24 = (pSVar23->geometries).items[uVar48].ptr;
                                uVar218 = *(uint *)(ray + lVar55 * 4 + 0x90);
                                auVar168._4_4_ = fVar226;
                                auVar168._0_4_ = fVar222;
                                auVar168._8_4_ = fVar229;
                                auVar172._12_4_ = fVar232;
                                auVar172._0_12_ = auVar168;
                                if ((pGVar24->mask & uVar218) == 0) goto LAB_002465c5;
                                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                   (pGVar24->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                  auVar179 = rcpps(auVar141,local_1b38);
                                  fVar184 = auVar179._0_4_;
                                  fVar167 = auVar179._4_4_;
                                  fVar177 = auVar179._8_4_;
                                  fVar102 = auVar179._12_4_;
                                  fVar152 = (float)(-(uint)(1e-18 <= ABS(fVar152)) &
                                                   (uint)(((float)DAT_01f7ba10 - fVar152 * fVar184)
                                                          * fVar184 + fVar184));
                                  fVar184 = (float)(-(uint)(1e-18 <= ABS(fVar189)) &
                                                   (uint)((DAT_01f7ba10._4_4_ - fVar189 * fVar167) *
                                                          fVar167 + fVar167));
                                  fVar167 = (float)(-(uint)(1e-18 <= ABS(fVar144)) &
                                                   (uint)((DAT_01f7ba10._8_4_ - fVar144 * fVar177) *
                                                          fVar177 + fVar177));
                                  fVar177 = (float)(-(uint)(1e-18 <= ABS(fVar150)) &
                                                   (uint)((DAT_01f7ba10._12_4_ - fVar150 * fVar102)
                                                          * fVar102 + fVar102));
                                  auVar89._0_4_ = local_1b58[0] * fVar152;
                                  auVar89._4_4_ = local_1b58[1] * fVar184;
                                  auVar89._8_4_ = local_1b58[2] * fVar167;
                                  auVar89._12_4_ = local_1b58[3] * fVar177;
                                  local_1b08 = minps(auVar89,_DAT_01f7ba10);
                                  auVar111._0_4_ = fVar166 * auVar141._0_4_ * fVar152;
                                  auVar111._4_4_ = fVar166 * auVar141._4_4_ * fVar184;
                                  auVar111._8_4_ = fVar166 * auVar141._8_4_ * fVar167;
                                  auVar111._12_4_ = fVar166 * auVar141._12_4_ * fVar177;
                                  local_1af8 = minps(auVar111,_DAT_01f7ba10);
                                  uVar60 = (ulong)(byte)uVar221;
                                  uVar59 = 0;
                                  if (uVar60 != 0) {
                                    for (; ((byte)uVar221 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1)
                                    {
                                    }
                                  }
                                  auVar179 = *(undefined1 (*) [16])
                                              (mm_lookupmask_ps +
                                              (long)(1 << ((byte)lVar55 & 0x1f)) * 0x10);
                                  do {
                                    local_19a8 = *(undefined4 *)(local_1b08 + uVar59 * 4);
                                    local_1998 = *(undefined4 *)(local_1af8 + uVar59 * 4);
                                    *(undefined4 *)(ray + lVar55 * 4 + 0x80) =
                                         *(undefined4 *)(local_1ae8 + uVar59 * 4);
                                    args.context = context->user;
                                    local_19d8[0] = *(float *)(local_1ad8 + uVar59 * 4);
                                    uVar49 = *(undefined4 *)(local_1ac8 + uVar59 * 4);
                                    uVar18 = *(undefined4 *)(local_1ab8 + uVar59 * 4);
                                    local_19c8._4_4_ = uVar49;
                                    local_19c8._0_4_ = uVar49;
                                    local_19c8._8_4_ = uVar49;
                                    local_19c8._12_4_ = uVar49;
                                    local_19b8._4_4_ = uVar18;
                                    local_19b8._0_4_ = uVar18;
                                    local_19b8._8_4_ = uVar18;
                                    local_19b8._12_4_ = uVar18;
                                    local_19d8[1] = local_19d8[0];
                                    local_19d8[2] = local_19d8[0];
                                    local_19d8[3] = local_19d8[0];
                                    uStack_19a4 = local_19a8;
                                    uStack_19a0 = local_19a8;
                                    uStack_199c = local_19a8;
                                    uStack_1994 = local_1998;
                                    uStack_1990 = local_1998;
                                    uStack_198c = local_1998;
                                    local_1988 = CONCAT44(uStack_1944,local_1948);
                                    uStack_1980 = CONCAT44(uStack_193c,uStack_1940);
                                    local_1978 = CONCAT44(uStack_1934,local_1938);
                                    uStack_1970 = CONCAT44(uStack_192c,uStack_1930);
                                    local_1968 = (args.context)->instID[0];
                                    uStack_1964 = local_1968;
                                    uStack_1960 = local_1968;
                                    uStack_195c = local_1968;
                                    local_1958 = (args.context)->instPrimID[0];
                                    uStack_1954 = local_1958;
                                    uStack_1950 = local_1958;
                                    uStack_194c = local_1958;
                                    args.valid = (int *)local_1bf8;
                                    pRVar54 = (RTCIntersectArguments *)pGVar24->userPtr;
                                    args.hit = (RTCHitN *)local_19d8;
                                    args.N = 4;
                                    pRVar52 = (RTCRayN *)pGVar24->occlusionFilterN;
                                    local_1bf8 = auVar179;
                                    args.geometryUserPtr = pRVar54;
                                    args.ray = (RTCRayN *)ray;
                                    if (pRVar52 != (RTCRayN *)0x0) {
                                      pRVar52 = (RTCRayN *)(*(code *)pRVar52)(&args);
                                      auVar172._4_4_ = fVar226;
                                      auVar172._0_4_ = fVar222;
                                      auVar172._8_4_ = fVar229;
                                    }
                                    if (local_1bf8 == (undefined1  [16])0x0) {
                                      auVar112._8_4_ = 0xffffffff;
                                      auVar112._0_8_ = 0xffffffffffffffff;
                                      auVar112._12_4_ = 0xffffffff;
                                      auVar112 = auVar112 ^ _DAT_01f7ae20;
                                    }
                                    else {
                                      pRVar54 = context->args;
                                      if ((pRVar54->filter != (RTCFilterFunctionN)0x0) &&
                                         (((pRVar54->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                                        (*pRVar54->filter)(&args);
                                        auVar172._4_4_ = fVar226;
                                        auVar172._0_4_ = fVar222;
                                        auVar172._8_4_ = fVar229;
                                      }
                                      auVar90._0_4_ = -(uint)(local_1bf8._0_4_ == 0);
                                      auVar90._4_4_ = -(uint)(local_1bf8._4_4_ == 0);
                                      auVar90._8_4_ = -(uint)(local_1bf8._8_4_ == 0);
                                      auVar90._12_4_ = -(uint)(local_1bf8._12_4_ == 0);
                                      auVar112 = auVar90 ^ _DAT_01f7ae20;
                                      auVar195 = blendvps(_DAT_01f7aa00,
                                                          *(undefined1 (*) [16])(args.ray + 0x80),
                                                          auVar90);
                                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar195;
                                      pRVar52 = args.ray;
                                    }
                                    auVar168 = auVar172._0_12_;
                                    uVar218 = (uint)pRVar52;
                                    if ((_DAT_01f7bb20 & auVar112) != (undefined1  [16])0x0)
                                    goto LAB_00246b40;
                                    *(float *)(ray + lVar55 * 4 + 0x80) = fVar178;
                                    uVar60 = uVar60 ^ 1L << (uVar59 & 0x3f);
                                    uVar59 = 0;
                                    if (uVar60 != 0) {
                                      for (; (uVar60 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                                      }
                                    }
                                  } while (uVar60 != 0);
                                  local_1918 = *(float *)(ray + lVar55 * 4 + 0x20);
                                  uVar49 = *(undefined4 *)(ray + lVar55 * 4 + 0x40);
                                  uVar18 = *(undefined4 *)(ray + lVar55 * 4 + 0x50);
                                  uVar19 = *(undefined4 *)(ray + lVar55 * 4 + 0x60);
                                  local_1c88._4_4_ = uVar49;
                                  local_1c88._0_4_ = uVar49;
                                  fStack_1c80 = (float)uVar49;
                                  fStack_1c7c = (float)uVar49;
                                  local_1c68._4_4_ = uVar18;
                                  local_1c68._0_4_ = uVar18;
                                  fStack_1c60 = (float)uVar18;
                                  fStack_1c5c = (float)uVar18;
                                  local_1c48._4_4_ = uVar19;
                                  local_1c48._0_4_ = uVar19;
                                  fStack_1c40 = (float)uVar19;
                                  fStack_1c3c = (float)uVar19;
                                  fStack_18ec = fVar165 - local_1918;
                                  fStack_1914 = local_1918;
                                  fStack_1910 = local_1918;
                                  fStack_190c = local_1918;
                                  fStack_1924 = fVar127 - local_1918;
                                  local_1908 = (fVar244 - local_1918) + (fVar198 - local_1918);
                                  fStack_1904 = (fVar229 - local_1918) + fStack_1924;
                                  fStack_1900 = (fVar200 - local_1918) + (fStack_1b60 - local_1918);
                                  fStack_18fc = fStack_18ec + (fStack_1b5c - local_1918);
                                  local_1928 = fVar198 - local_1918;
                                  fStack_1920 = fStack_1b60 - local_1918;
                                  fStack_191c = fStack_1b5c - local_1918;
                                  local_18f8 = fVar244 - local_1918;
                                  fStack_18f4 = fVar229 - local_1918;
                                  fStack_18f0 = fVar200 - local_1918;
                                  goto LAB_002465c5;
                                }
LAB_00246b40:
                                valid0.field_0.v[lVar55] = 0.0;
                              }
                              uVar60 = local_19e0 - 1;
                              uVar56 = local_19e0 & uVar60;
                              valid_i = (vint<4> *)(ulong)local_1bdc;
                              lVar57 = local_1a00;
                              uVar59 = local_19f8;
                            } while (uVar56 != 0);
                          }
                          local_1b78._0_4_ = local_1b78.i[0] & valid0.field_0._0_4_;
                          local_1b78._4_4_ = uVar209 & valid0.field_0._4_4_;
                          local_1b78.i[2] = uVar214 & valid0.field_0._8_4_;
                          local_1b78.i[3] = uVar216 & valid0.field_0._12_4_;
                          iVar50 = movmskps((int)uVar60,(undefined1  [16])local_1b78);
                          bVar67 = iVar50 == 0;
                        }
                      } while ((!bVar67) && (uVar59 = uVar59 & uVar59 - 1, uVar59 != 0));
                    }
                    lVar55 = local_1a08 + 1;
                  } while (lVar55 != local_1a10);
                  aVar143._0_8_ = local_1b78._0_8_ ^ 0xffffffffffffffff;
                  aVar143._8_4_ = local_1b78._8_4_ ^ 0xffffffff;
                  aVar143._12_4_ = local_1b78._12_4_ ^ 0xffffffff;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     ((undefined1  [16])terminated.field_0 | (undefined1  [16])aVar143);
                uVar48 = movmskps((int)lVar55,(undefined1  [16])terminated.field_0);
                uVar51 = (ulong)uVar48;
                if (uVar48 == 0xf) goto LAB_00246f6f;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                              (undefined1  [16])terminated.field_0);
              }
              goto LAB_0024517d;
            }
            uVar51 = root.ptr & 0xfffffffffffffff0;
            uVar48 = (uint)root.ptr & 7;
            pRVar54 = (RTCIntersectArguments *)(ulong)uVar48;
            lVar55 = -0x10;
            sVar58 = 8;
            aVar129 = _DAT_01f7a9f0;
            do {
              sVar22 = *(size_t *)(uVar51 + 0x20 + lVar55 * 2);
              root.ptr = sVar58;
              if (sVar22 == 8) break;
              fVar100 = *(float *)(uVar51 + 0x90 + lVar55);
              fVar152 = *(float *)(uVar51 + 0x30 + lVar55);
              fVar178 = *(float *)(uVar51 + 0x40 + lVar55);
              fVar166 = *(float *)(uVar51 + 0x50 + lVar55);
              fVar184 = *(float *)(uVar51 + 0x60 + lVar55);
              fVar144 = *(float *)(ray + 0x70);
              fVar153 = *(float *)(ray + 0x74);
              fVar150 = *(float *)(ray + 0x78);
              fVar151 = *(float *)(ray + 0x7c);
              fVar167 = *(float *)(uVar51 + 0xb0 + lVar55);
              fVar177 = *(float *)(uVar51 + 0xd0 + lVar55);
              fVar186 = *(float *)(uVar51 + 0x70 + lVar55);
              fVar189 = *(float *)(uVar51 + 0xa0 + lVar55);
              fVar208 = *(float *)(uVar51 + 0xc0 + lVar55);
              fVar102 = *(float *)(uVar51 + 0xe0 + lVar55);
              fVar127 = *(float *)(uVar51 + 0x80 + lVar55);
              fVar71 = ((fVar100 * fVar144 + fVar152) - (float)tray.org.field_0._0_4_) *
                       tray.rdir.field_0._0_4_;
              fVar98 = ((fVar100 * fVar153 + fVar152) - (float)tray.org.field_0._4_4_) *
                       tray.rdir.field_0._4_4_;
              fVar99 = ((fVar100 * fVar150 + fVar152) - (float)tray.org.field_0._8_4_) *
                       tray.rdir.field_0._8_4_;
              fVar100 = ((fVar100 * fVar151 + fVar152) - (float)tray.org.field_0._12_4_) *
                        tray.rdir.field_0._12_4_;
              fVar152 = ((fVar167 * fVar144 + fVar166) - (float)tray.org.field_0._16_4_) *
                        (float)tray.rdir.field_0._16_4_;
              fVar164 = ((fVar167 * fVar153 + fVar166) - (float)tray.org.field_0._20_4_) *
                        (float)tray.rdir.field_0._20_4_;
              fVar165 = ((fVar167 * fVar150 + fVar166) - (float)tray.org.field_0._24_4_) *
                        (float)tray.rdir.field_0._24_4_;
              fVar166 = ((fVar167 * fVar151 + fVar166) - (float)tray.org.field_0._28_4_) *
                        (float)tray.rdir.field_0._28_4_;
              fVar167 = ((fVar177 * fVar144 + fVar186) - (float)tray.org.field_0._32_4_) *
                        (float)tray.rdir.field_0._32_4_;
              fVar175 = ((fVar177 * fVar153 + fVar186) - (float)tray.org.field_0._36_4_) *
                        (float)tray.rdir.field_0._36_4_;
              fVar176 = ((fVar177 * fVar150 + fVar186) - (float)tray.org.field_0._40_4_) *
                        (float)tray.rdir.field_0._40_4_;
              fVar177 = ((fVar177 * fVar151 + fVar186) - (float)tray.org.field_0._44_4_) *
                        (float)tray.rdir.field_0._44_4_;
              fVar192 = ((fVar189 * fVar144 + fVar178) - (float)tray.org.field_0._0_4_) *
                        tray.rdir.field_0._0_4_;
              fVar198 = ((fVar189 * fVar153 + fVar178) - (float)tray.org.field_0._4_4_) *
                        tray.rdir.field_0._4_4_;
              fVar199 = ((fVar189 * fVar150 + fVar178) - (float)tray.org.field_0._8_4_) *
                        tray.rdir.field_0._8_4_;
              fVar200 = ((fVar189 * fVar151 + fVar178) - (float)tray.org.field_0._12_4_) *
                        tray.rdir.field_0._12_4_;
              fVar201 = ((fVar208 * fVar144 + fVar184) - (float)tray.org.field_0._16_4_) *
                        (float)tray.rdir.field_0._16_4_;
              fVar206 = ((fVar208 * fVar153 + fVar184) - (float)tray.org.field_0._20_4_) *
                        (float)tray.rdir.field_0._20_4_;
              fVar207 = ((fVar208 * fVar150 + fVar184) - (float)tray.org.field_0._24_4_) *
                        (float)tray.rdir.field_0._24_4_;
              fVar208 = ((fVar208 * fVar151 + fVar184) - (float)tray.org.field_0._28_4_) *
                        (float)tray.rdir.field_0._28_4_;
              fVar178 = ((fVar102 * fVar144 + fVar127) - (float)tray.org.field_0._32_4_) *
                        (float)tray.rdir.field_0._32_4_;
              fVar184 = ((fVar102 * fVar153 + fVar127) - (float)tray.org.field_0._36_4_) *
                        (float)tray.rdir.field_0._36_4_;
              fVar186 = ((fVar102 * fVar150 + fVar127) - (float)tray.org.field_0._40_4_) *
                        (float)tray.rdir.field_0._40_4_;
              fVar189 = ((fVar102 * fVar151 + fVar127) - (float)tray.org.field_0._44_4_) *
                        (float)tray.rdir.field_0._44_4_;
              uVar209 = (uint)((int)fVar192 < (int)fVar71) * (int)fVar192 |
                        (uint)((int)fVar192 >= (int)fVar71) * (int)fVar71;
              uVar214 = (uint)((int)fVar198 < (int)fVar98) * (int)fVar198 |
                        (uint)((int)fVar198 >= (int)fVar98) * (int)fVar98;
              uVar216 = (uint)((int)fVar199 < (int)fVar99) * (int)fVar199 |
                        (uint)((int)fVar199 >= (int)fVar99) * (int)fVar99;
              uVar218 = (uint)((int)fVar200 < (int)fVar100) * (int)fVar200 |
                        (uint)((int)fVar200 >= (int)fVar100) * (int)fVar100;
              uVar221 = (uint)((int)fVar201 < (int)fVar152) * (int)fVar201 |
                        (uint)((int)fVar201 >= (int)fVar152) * (int)fVar152;
              uVar225 = (uint)((int)fVar206 < (int)fVar164) * (int)fVar206 |
                        (uint)((int)fVar206 >= (int)fVar164) * (int)fVar164;
              uVar228 = (uint)((int)fVar207 < (int)fVar165) * (int)fVar207 |
                        (uint)((int)fVar207 >= (int)fVar165) * (int)fVar165;
              uVar231 = (uint)((int)fVar208 < (int)fVar166) * (int)fVar208 |
                        (uint)((int)fVar208 >= (int)fVar166) * (int)fVar166;
              uVar221 = ((int)uVar221 < (int)uVar209) * uVar209 |
                        ((int)uVar221 >= (int)uVar209) * uVar221;
              uVar225 = ((int)uVar225 < (int)uVar214) * uVar214 |
                        ((int)uVar225 >= (int)uVar214) * uVar225;
              uVar228 = ((int)uVar228 < (int)uVar216) * uVar216 |
                        ((int)uVar228 >= (int)uVar216) * uVar228;
              uVar231 = ((int)uVar231 < (int)uVar218) * uVar218 |
                        ((int)uVar231 >= (int)uVar218) * uVar231;
              uVar209 = (uint)((int)fVar178 < (int)fVar167) * (int)fVar178 |
                        (uint)((int)fVar178 >= (int)fVar167) * (int)fVar167;
              uVar214 = (uint)((int)fVar184 < (int)fVar175) * (int)fVar184 |
                        (uint)((int)fVar184 >= (int)fVar175) * (int)fVar175;
              uVar216 = (uint)((int)fVar186 < (int)fVar176) * (int)fVar186 |
                        (uint)((int)fVar186 >= (int)fVar176) * (int)fVar176;
              uVar218 = (uint)((int)fVar189 < (int)fVar177) * (int)fVar189 |
                        (uint)((int)fVar189 >= (int)fVar177) * (int)fVar177;
              auVar211._0_4_ =
                   (float)(((int)uVar209 < (int)uVar221) * uVar221 |
                          ((int)uVar209 >= (int)uVar221) * uVar209) * 0.99999964;
              auVar211._4_4_ =
                   (float)(((int)uVar214 < (int)uVar225) * uVar225 |
                          ((int)uVar214 >= (int)uVar225) * uVar214) * 0.99999964;
              auVar211._8_4_ =
                   (float)(((int)uVar216 < (int)uVar228) * uVar228 |
                          ((int)uVar216 >= (int)uVar228) * uVar216) * 0.99999964;
              auVar211._12_4_ =
                   (float)(((int)uVar218 < (int)uVar231) * uVar231 |
                          ((int)uVar218 >= (int)uVar231) * uVar218) * 0.99999964;
              uVar209 = (uint)((int)fVar192 < (int)fVar71) * (int)fVar71 |
                        (uint)((int)fVar192 >= (int)fVar71) * (int)fVar192;
              uVar214 = (uint)((int)fVar198 < (int)fVar98) * (int)fVar98 |
                        (uint)((int)fVar198 >= (int)fVar98) * (int)fVar198;
              uVar216 = (uint)((int)fVar199 < (int)fVar99) * (int)fVar99 |
                        (uint)((int)fVar199 >= (int)fVar99) * (int)fVar199;
              uVar218 = (uint)((int)fVar200 < (int)fVar100) * (int)fVar100 |
                        (uint)((int)fVar200 >= (int)fVar100) * (int)fVar200;
              uVar221 = (uint)((int)fVar201 < (int)fVar152) * (int)fVar152 |
                        (uint)((int)fVar201 >= (int)fVar152) * (int)fVar201;
              uVar225 = (uint)((int)fVar206 < (int)fVar164) * (int)fVar164 |
                        (uint)((int)fVar206 >= (int)fVar164) * (int)fVar206;
              uVar228 = (uint)((int)fVar207 < (int)fVar165) * (int)fVar165 |
                        (uint)((int)fVar207 >= (int)fVar165) * (int)fVar207;
              uVar231 = (uint)((int)fVar208 < (int)fVar166) * (int)fVar166 |
                        (uint)((int)fVar208 >= (int)fVar166) * (int)fVar208;
              uVar221 = ((int)uVar209 < (int)uVar221) * uVar209 |
                        ((int)uVar209 >= (int)uVar221) * uVar221;
              uVar225 = ((int)uVar214 < (int)uVar225) * uVar214 |
                        ((int)uVar214 >= (int)uVar225) * uVar225;
              uVar228 = ((int)uVar216 < (int)uVar228) * uVar216 |
                        ((int)uVar216 >= (int)uVar228) * uVar228;
              uVar231 = ((int)uVar218 < (int)uVar231) * uVar218 |
                        ((int)uVar218 >= (int)uVar231) * uVar231;
              uVar209 = (uint)((int)fVar178 < (int)fVar167) * (int)fVar167 |
                        (uint)((int)fVar178 >= (int)fVar167) * (int)fVar178;
              uVar214 = (uint)((int)fVar184 < (int)fVar175) * (int)fVar175 |
                        (uint)((int)fVar184 >= (int)fVar175) * (int)fVar184;
              uVar216 = (uint)((int)fVar186 < (int)fVar176) * (int)fVar176 |
                        (uint)((int)fVar186 >= (int)fVar176) * (int)fVar186;
              uVar218 = (uint)((int)fVar189 < (int)fVar177) * (int)fVar177 |
                        (uint)((int)fVar189 >= (int)fVar177) * (int)fVar189;
              fVar100 = (float)(((int)uVar221 < (int)uVar209) * uVar221 |
                               ((int)uVar221 >= (int)uVar209) * uVar209) * 1.0000004;
              fVar152 = (float)(((int)uVar225 < (int)uVar214) * uVar225 |
                               ((int)uVar225 >= (int)uVar214) * uVar214) * 1.0000004;
              fVar178 = (float)(((int)uVar228 < (int)uVar216) * uVar228 |
                               ((int)uVar228 >= (int)uVar216) * uVar216) * 1.0000004;
              fVar166 = (float)(((int)uVar231 < (int)uVar218) * uVar231 |
                               ((int)uVar231 >= (int)uVar218) * uVar218) * 1.0000004;
              bVar67 = (float)((uint)(tray.tnear.field_0.i[0] < (int)auVar211._0_4_) *
                               (int)auVar211._0_4_ |
                              (uint)(tray.tnear.field_0.i[0] >= (int)auVar211._0_4_) *
                              tray.tnear.field_0.i[0]) <=
                       (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar100) *
                               tray.tfar.field_0.i[0] |
                              (uint)(tray.tfar.field_0.i[0] >= (int)fVar100) * (int)fVar100);
              bVar29 = (float)((uint)(tray.tnear.field_0.i[1] < (int)auVar211._4_4_) *
                               (int)auVar211._4_4_ |
                              (uint)(tray.tnear.field_0.i[1] >= (int)auVar211._4_4_) *
                              tray.tnear.field_0.i[1]) <=
                       (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar152) *
                               tray.tfar.field_0.i[1] |
                              (uint)(tray.tfar.field_0.i[1] >= (int)fVar152) * (int)fVar152);
              bVar30 = (float)((uint)(tray.tnear.field_0.i[2] < (int)auVar211._8_4_) *
                               (int)auVar211._8_4_ |
                              (uint)(tray.tnear.field_0.i[2] >= (int)auVar211._8_4_) *
                              tray.tnear.field_0.i[2]) <=
                       (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar178) *
                               tray.tfar.field_0.i[2] |
                              (uint)(tray.tfar.field_0.i[2] >= (int)fVar178) * (int)fVar178);
              bVar31 = (float)((uint)(tray.tnear.field_0.i[3] < (int)auVar211._12_4_) *
                               (int)auVar211._12_4_ |
                              (uint)(tray.tnear.field_0.i[3] >= (int)auVar211._12_4_) *
                              tray.tnear.field_0.i[3]) <=
                       (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar166) *
                               tray.tfar.field_0.i[3] |
                              (uint)(tray.tfar.field_0.i[3] >= (int)fVar166) * (int)fVar166);
              if (uVar48 == 6) {
                fVar100 = *(float *)(uVar51 + 0xf0 + lVar55);
                fVar152 = *(float *)(uVar51 + 0x100 + lVar55);
                bVar67 = (fVar144 < fVar152 && fVar100 <= fVar144) && bVar67;
                bVar29 = (fVar153 < fVar152 && fVar100 <= fVar153) && bVar29;
                bVar30 = (fVar150 < fVar152 && fVar100 <= fVar150) && bVar30;
                bVar31 = (fVar151 < fVar152 && fVar100 <= fVar151) && bVar31;
              }
              auVar73._0_4_ = (-(uint)bVar67 & -(uint)(fVar220 < tray.tfar.field_0.v[0])) << 0x1f;
              auVar73._4_4_ = (-(uint)bVar29 & -(uint)(fVar224 < tray.tfar.field_0.v[1])) << 0x1f;
              auVar73._8_4_ = (-(uint)bVar30 & -(uint)(fVar227 < tray.tfar.field_0.v[2])) << 0x1f;
              auVar73._12_4_ = (-(uint)bVar31 & -(uint)(fVar230 < tray.tfar.field_0.v[3])) << 0x1f;
              uVar209 = movmskps((int)valid_i,auVar73);
              valid_i = (vint<4> *)(ulong)uVar209;
              aVar146 = aVar129;
              if ((uVar209 != 0) &&
                 (aVar146.v = (__m128)blendvps(_DAT_01f7a9f0,auVar211,auVar73), root.ptr = sVar22,
                 sVar58 != 8)) {
                pNVar65->ptr = sVar58;
                pNVar65 = pNVar65 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar66->v = aVar129;
                paVar66 = paVar66 + 1;
              }
              aVar129 = aVar146;
              lVar55 = lVar55 + 4;
              sVar58 = root.ptr;
            } while (lVar55 != 0);
            if (root.ptr == 8) goto LAB_0024545a;
            auVar74._4_4_ = -(uint)(aVar129.v[1] < tray.tfar.field_0.v[1]);
            auVar74._0_4_ = -(uint)(aVar129.v[0] < tray.tfar.field_0.v[0]);
            auVar74._8_4_ = -(uint)(aVar129.v[2] < tray.tfar.field_0.v[2]);
            auVar74._12_4_ = -(uint)(aVar129.v[3] < tray.tfar.field_0.v[3]);
            uVar49 = movmskps((int)uVar51,auVar74);
            uVar51 = (ulong)(uint)POPCOUNT(uVar49);
          } while ((byte)uVar53 < (byte)POPCOUNT(uVar49));
          pNVar65->ptr = root.ptr;
          pNVar65 = pNVar65 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar66->v = aVar129;
          paVar66 = paVar66 + 1;
LAB_0024545a:
          uVar51 = 4;
        }
        else {
          do {
            sVar58 = 0;
            if (uVar59 != 0) {
              for (; (uVar59 >> sVar58 & 1) == 0; sVar58 = sVar58 + 1) {
              }
            }
            tray_00 = &tray;
            valid_i = (vint<4> *)local_1a18;
            bVar67 = occluded1(local_1a18,local_1a20,root,sVar58,&pre,ray,tray_00,context);
            if (bVar67) {
              terminated.field_0.i[sVar58] = -1;
            }
            uVar59 = uVar59 & uVar59 - 1;
          } while (uVar59 != 0);
          uVar209 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
          pRVar54 = (RTCIntersectArguments *)(ulong)uVar209;
          uVar51 = 3;
          if (uVar209 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                          (undefined1  [16])terminated.field_0);
            uVar51 = 2;
          }
          if (uVar53 < (uint)POPCOUNT(uVar48 & 0xff)) goto LAB_002451c3;
        }
      } while ((int)uVar51 != 3);
LAB_00246f6f:
      auVar97._0_4_ = auVar103._0_4_ & terminated.field_0.i[0];
      auVar97._4_4_ = auVar103._4_4_ & terminated.field_0.i[1];
      auVar97._8_4_ = auVar103._8_4_ & terminated.field_0.i[2];
      auVar97._12_4_ = auVar103._12_4_ & terminated.field_0.i[3];
      auVar179 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa00,auVar97);
      *(undefined1 (*) [16])(ray + 0x80) = auVar179;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }